

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<8,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  RTCRayQueryContext *pRVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  size_t k;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [28];
  byte bVar47;
  int iVar48;
  ulong uVar49;
  byte bVar50;
  byte bVar51;
  long lVar52;
  undefined1 (*pauVar53) [32];
  ulong uVar54;
  byte bVar55;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  long lVar56;
  ulong *puVar57;
  NodeRef root;
  ulong uVar58;
  long lVar59;
  undefined4 uVar60;
  float *pfVar61;
  bool bVar62;
  ulong uVar63;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar64 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  float fVar99;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar125 [32];
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar133 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar143 [36];
  undefined1 auVar142 [64];
  undefined1 auVar145 [16];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  Precalculations pre;
  vfloat<8> lower_y;
  vfloat<8> upper_y;
  vfloat<8> upper_z;
  vfloat<8> lower_z;
  vfloat<8> lower_x;
  TravRayK<8,_false> tray;
  vfloat<8> upper_x;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  byte local_5f24;
  Precalculations local_5f09;
  uint local_5f08;
  uint local_5f04;
  undefined1 local_5f00 [16];
  undefined1 local_5ef0 [16];
  float local_5ee0;
  float fStack_5edc;
  float fStack_5ed8;
  float fStack_5ed4;
  float fStack_5ed0;
  float fStack_5ecc;
  float fStack_5ec8;
  float fStack_5ec4;
  Geometry *local_5eb0;
  undefined4 local_5ea4;
  RTCFilterFunctionNArguments local_5ea0;
  undefined1 local_5e60 [8];
  float fStack_5e58;
  float fStack_5e54;
  float fStack_5e50;
  float fStack_5e4c;
  float fStack_5e48;
  float fStack_5e44;
  undefined1 (*local_5e28) [32];
  RayK<8> *local_5e20;
  long local_5e18;
  long local_5e10;
  ulong local_5e08;
  undefined1 local_5e00 [32];
  float local_5de0;
  float fStack_5ddc;
  float fStack_5dd8;
  float fStack_5dd4;
  float fStack_5dd0;
  float fStack_5dcc;
  float fStack_5dc8;
  float fStack_5dc4;
  BVH *local_5db0;
  Intersectors *local_5da8;
  long local_5da0;
  long local_5d98;
  long local_5d90;
  ulong local_5d88;
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  undefined1 local_5d20 [32];
  undefined1 local_5d00 [32];
  float local_5ce0;
  float fStack_5cdc;
  float fStack_5cd8;
  float fStack_5cd4;
  float fStack_5cd0;
  float fStack_5ccc;
  float fStack_5cc8;
  int iStack_5cc4;
  RTCHitN local_5cc0 [32];
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [32];
  undefined1 local_5c60 [8];
  float fStack_5c58;
  float fStack_5c54;
  float fStack_5c50;
  float fStack_5c4c;
  float fStack_5c48;
  uint uStack_5c44;
  undefined1 local_5c40 [8];
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  float fStack_5c24;
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  uint local_5be0;
  uint uStack_5bdc;
  uint uStack_5bd8;
  uint uStack_5bd4;
  uint uStack_5bd0;
  uint uStack_5bcc;
  uint uStack_5bc8;
  uint uStack_5bc4;
  uint local_5bc0;
  uint uStack_5bbc;
  uint uStack_5bb8;
  uint uStack_5bb4;
  uint uStack_5bb0;
  uint uStack_5bac;
  uint uStack_5ba8;
  uint uStack_5ba4;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5ba0;
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  float local_5a80;
  float fStack_5a7c;
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  undefined4 uStack_5a64;
  float local_5a60;
  float fStack_5a5c;
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  undefined4 uStack_5a44;
  undefined1 local_5a40 [32];
  int local_5a20;
  int iStack_5a1c;
  int iStack_5a18;
  int iStack_5a14;
  int iStack_5a10;
  int iStack_5a0c;
  int iStack_5a08;
  int iStack_5a04;
  uint local_5a00;
  uint uStack_59fc;
  uint uStack_59f8;
  uint uStack_59f4;
  uint uStack_59f0;
  uint uStack_59ec;
  uint uStack_59e8;
  uint uStack_59e4;
  uint local_59e0;
  uint uStack_59dc;
  uint uStack_59d8;
  uint uStack_59d4;
  uint uStack_59d0;
  uint uStack_59cc;
  uint uStack_59c8;
  uint uStack_59c4;
  undefined1 local_59c0 [32];
  uint local_59a0;
  uint uStack_599c;
  uint uStack_5998;
  uint uStack_5994;
  uint uStack_5990;
  uint uStack_598c;
  uint uStack_5988;
  uint uStack_5984;
  undefined1 local_5980 [32];
  undefined8 local_5960;
  undefined8 uStack_5958;
  undefined8 local_5950;
  undefined8 uStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 local_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 local_5910;
  undefined8 uStack_5908;
  undefined8 local_5900;
  undefined8 uStack_58f8;
  undefined8 local_58f0;
  undefined8 uStack_58e8;
  undefined8 local_58e0;
  undefined8 uStack_58d8;
  undefined8 local_58d0;
  undefined8 uStack_58c8;
  undefined8 local_58c0;
  undefined8 uStack_58b8;
  undefined8 local_58b0;
  undefined8 uStack_58a8;
  undefined8 local_58a0;
  undefined8 uStack_5898;
  undefined8 local_5890;
  undefined8 uStack_5888;
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  float fStack_5864;
  float local_5860;
  float fStack_585c;
  float fStack_5858;
  float fStack_5854;
  float fStack_5850;
  float fStack_584c;
  float fStack_5848;
  float fStack_5844;
  float local_5840;
  float fStack_583c;
  float fStack_5838;
  float fStack_5834;
  float fStack_5830;
  float fStack_582c;
  float fStack_5828;
  float fStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar144 [36];
  
  local_5808 = (((BVH *)This->ptr)->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar70 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar64 = ZEXT816(0) << 0x40;
      uVar63 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar64),5);
      uVar58 = vpcmpeqd_avx512vl(auVar70,(undefined1  [32])valid_i->field_0);
      uVar63 = uVar63 & uVar58;
      local_5f24 = (byte)uVar63;
      if (local_5f24 != 0) {
        local_5ba0._0_4_ = *(float *)ray;
        local_5ba0._4_4_ = *(float *)(ray + 4);
        local_5ba0._8_4_ = *(float *)(ray + 8);
        local_5ba0._12_4_ = *(float *)(ray + 0xc);
        local_5ba0._16_4_ = *(float *)(ray + 0x10);
        local_5ba0._20_4_ = *(float *)(ray + 0x14);
        local_5ba0._24_4_ = *(float *)(ray + 0x18);
        local_5ba0._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5ba0._32_4_ = *(float *)(ray + 0x20);
        local_5ba0._36_4_ = *(float *)(ray + 0x24);
        local_5ba0._40_4_ = *(float *)(ray + 0x28);
        local_5ba0._44_4_ = *(float *)(ray + 0x2c);
        local_5ba0._48_4_ = *(float *)(ray + 0x30);
        local_5ba0._52_4_ = *(float *)(ray + 0x34);
        local_5ba0._56_4_ = *(float *)(ray + 0x38);
        local_5ba0._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5ba0._64_4_ = *(float *)(ray + 0x40);
        local_5ba0._68_4_ = *(float *)(ray + 0x44);
        local_5ba0._72_4_ = *(float *)(ray + 0x48);
        local_5ba0._76_4_ = *(float *)(ray + 0x4c);
        local_5ba0._80_4_ = *(float *)(ray + 0x50);
        local_5ba0._84_4_ = *(float *)(ray + 0x54);
        local_5ba0._88_4_ = *(float *)(ray + 0x58);
        local_5ba0._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_5b40 = *(undefined1 (*) [32])(ray + 0x80);
        local_5b20 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5b00 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar146 = ZEXT3264(auVar70);
        vandps_avx512vl(local_5b40,auVar70);
        auVar71._8_4_ = 0x219392ef;
        auVar71._0_8_ = 0x219392ef219392ef;
        auVar71._12_4_ = 0x219392ef;
        auVar71._16_4_ = 0x219392ef;
        auVar71._20_4_ = 0x219392ef;
        auVar71._24_4_ = 0x219392ef;
        auVar71._28_4_ = 0x219392ef;
        uVar58 = vcmpps_avx512vl(auVar70,auVar71,1);
        bVar62 = (bool)((byte)uVar58 & 1);
        auVar72._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b40._0_4_;
        bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar72._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b40._4_4_;
        bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar72._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b40._8_4_;
        bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar72._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b40._12_4_;
        bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar72._16_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b40._16_4_;
        bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar72._20_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b40._20_4_;
        bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar72._24_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b40._24_4_;
        bVar62 = SUB81(uVar58 >> 7,0);
        auVar72._28_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b40._28_4_;
        vandps_avx512vl(local_5b20,auVar70);
        uVar58 = vcmpps_avx512vl(auVar72,auVar71,1);
        bVar62 = (bool)((byte)uVar58 & 1);
        auVar75._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b20._0_4_;
        bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar75._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b20._4_4_;
        bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar75._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b20._8_4_;
        bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar75._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b20._12_4_;
        bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar75._16_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b20._16_4_;
        bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar75._20_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b20._20_4_;
        bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar75._24_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b20._24_4_;
        bVar62 = SUB81(uVar58 >> 7,0);
        auVar75._28_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b20._28_4_;
        vandps_avx512vl(local_5b00,auVar70);
        uVar58 = vcmpps_avx512vl(auVar75,auVar71,1);
        bVar62 = (bool)((byte)uVar58 & 1);
        auVar70._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b00._0_4_;
        bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar70._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b00._4_4_;
        bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar70._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b00._8_4_;
        bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar70._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b00._12_4_;
        bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar70._16_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b00._16_4_;
        bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar70._20_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b00._20_4_;
        bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar70._24_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b00._24_4_;
        bVar62 = SUB81(uVar58 >> 7,0);
        auVar70._28_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * local_5b00._28_4_;
        auVar73._8_4_ = 0x3f800000;
        auVar73._0_8_ = 0x3f8000003f800000;
        auVar73._12_4_ = 0x3f800000;
        auVar73._16_4_ = 0x3f800000;
        auVar73._20_4_ = 0x3f800000;
        auVar73._24_4_ = 0x3f800000;
        auVar73._28_4_ = 0x3f800000;
        auVar71 = vrcp14ps_avx512vl(auVar72);
        auVar65 = vfnmadd213ps_fma(auVar72,auVar71,auVar73);
        auVar65 = vfmadd132ps_fma(ZEXT1632(auVar65),auVar71,auVar71);
        auVar72 = vrcp14ps_avx512vl(auVar75);
        auVar66 = vfnmadd213ps_fma(auVar75,auVar72,auVar73);
        auVar66 = vfmadd132ps_fma(ZEXT1632(auVar66),auVar72,auVar72);
        auVar72 = vrcp14ps_avx512vl(auVar70);
        auVar69 = vfnmadd213ps_fma(auVar70,auVar72,auVar73);
        local_5ae0 = ZEXT1632(auVar65);
        local_5ac0 = ZEXT1632(auVar66);
        auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar72,auVar72);
        local_5aa0 = ZEXT1632(auVar69);
        local_5a40._4_4_ = *(float *)(ray + 0x44) * auVar69._4_4_;
        local_5a40._0_4_ = *(float *)(ray + 0x40) * auVar69._0_4_;
        local_5a40._8_4_ = *(float *)(ray + 0x48) * auVar69._8_4_;
        local_5a40._12_4_ = *(float *)(ray + 0x4c) * auVar69._12_4_;
        local_5a40._16_4_ = *(float *)(ray + 0x50) * 0.0;
        local_5a40._20_4_ = *(float *)(ray + 0x54) * 0.0;
        local_5a40._24_4_ = *(float *)(ray + 0x58) * 0.0;
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x5c);
        local_5a80 = *(float *)ray * auVar65._0_4_;
        fStack_5a7c = *(float *)(ray + 4) * auVar65._4_4_;
        fStack_5a78 = *(float *)(ray + 8) * auVar65._8_4_;
        fStack_5a74 = *(float *)(ray + 0xc) * auVar65._12_4_;
        fStack_5a70 = *(float *)(ray + 0x10) * 0.0;
        fStack_5a6c = *(float *)(ray + 0x14) * 0.0;
        fStack_5a68 = *(float *)(ray + 0x18) * 0.0;
        uStack_5a64 = *(undefined4 *)(ray + 0x1c);
        local_5a60 = *(float *)(ray + 0x20) * auVar66._0_4_;
        fStack_5a5c = *(float *)(ray + 0x24) * auVar66._4_4_;
        fStack_5a58 = *(float *)(ray + 0x28) * auVar66._8_4_;
        fStack_5a54 = *(float *)(ray + 0x2c) * auVar66._12_4_;
        fStack_5a50 = *(float *)(ray + 0x30) * 0.0;
        fStack_5a4c = *(float *)(ray + 0x34) * 0.0;
        fStack_5a48 = *(float *)(ray + 0x38) * 0.0;
        uStack_5a44 = *(undefined4 *)(ray + 0x3c);
        uVar58 = vcmpps_avx512vl(ZEXT1632(auVar65),ZEXT1632(auVar64),1);
        auVar70 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_5a20 = (uint)((byte)uVar58 & 1) * auVar70._0_4_;
        iStack_5a1c = (uint)((byte)(uVar58 >> 1) & 1) * auVar70._4_4_;
        iStack_5a18 = (uint)((byte)(uVar58 >> 2) & 1) * auVar70._8_4_;
        iStack_5a14 = (uint)((byte)(uVar58 >> 3) & 1) * auVar70._12_4_;
        iStack_5a10 = (uint)((byte)(uVar58 >> 4) & 1) * auVar70._16_4_;
        iStack_5a0c = (uint)((byte)(uVar58 >> 5) & 1) * auVar70._20_4_;
        iStack_5a08 = (uint)((byte)(uVar58 >> 6) & 1) * auVar70._24_4_;
        iStack_5a04 = (uint)(byte)(uVar58 >> 7) * auVar70._28_4_;
        auVar72 = ZEXT1632(auVar64);
        uVar58 = vcmpps_avx512vl(ZEXT1632(auVar66),auVar72,5);
        auVar70 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar62 = (bool)((byte)uVar58 & 1);
        bVar14 = (bool)((byte)(uVar58 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar58 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar58 >> 3) & 1);
        bVar17 = (bool)((byte)(uVar58 >> 4) & 1);
        bVar18 = (bool)((byte)(uVar58 >> 5) & 1);
        bVar21 = (bool)((byte)(uVar58 >> 6) & 1);
        bVar24 = SUB81(uVar58 >> 7,0);
        local_5a00 = (uint)bVar62 * auVar70._0_4_ | (uint)!bVar62 * 0x60;
        uStack_59fc = (uint)bVar14 * auVar70._4_4_ | (uint)!bVar14 * 0x60;
        uStack_59f8 = (uint)bVar15 * auVar70._8_4_ | (uint)!bVar15 * 0x60;
        uStack_59f4 = (uint)bVar16 * auVar70._12_4_ | (uint)!bVar16 * 0x60;
        uStack_59f0 = (uint)bVar17 * auVar70._16_4_ | (uint)!bVar17 * 0x60;
        uStack_59ec = (uint)bVar18 * auVar70._20_4_ | (uint)!bVar18 * 0x60;
        uStack_59e8 = (uint)bVar21 * auVar70._24_4_ | (uint)!bVar21 * 0x60;
        uStack_59e4 = (uint)bVar24 * auVar70._28_4_ | (uint)!bVar24 * 0x60;
        uVar58 = vcmpps_avx512vl(ZEXT1632(auVar69),auVar72,5);
        auVar70 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar62 = (bool)((byte)uVar58 & 1);
        bVar14 = (bool)((byte)(uVar58 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar58 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar58 >> 3) & 1);
        bVar17 = (bool)((byte)(uVar58 >> 4) & 1);
        bVar18 = (bool)((byte)(uVar58 >> 5) & 1);
        bVar21 = (bool)((byte)(uVar58 >> 6) & 1);
        bVar24 = SUB81(uVar58 >> 7,0);
        local_59e0 = (uint)bVar62 * auVar70._0_4_ | (uint)!bVar62 * 0xa0;
        uStack_59dc = (uint)bVar14 * auVar70._4_4_ | (uint)!bVar14 * 0xa0;
        uStack_59d8 = (uint)bVar15 * auVar70._8_4_ | (uint)!bVar15 * 0xa0;
        uStack_59d4 = (uint)bVar16 * auVar70._12_4_ | (uint)!bVar16 * 0xa0;
        uStack_59d0 = (uint)bVar17 * auVar70._16_4_ | (uint)!bVar17 * 0xa0;
        uStack_59cc = (uint)bVar18 * auVar70._20_4_ | (uint)!bVar18 * 0xa0;
        uStack_59c8 = (uint)bVar21 * auVar70._24_4_ | (uint)!bVar21 * 0xa0;
        uStack_59c4 = (uint)bVar24 * auVar70._28_4_ | (uint)!bVar24 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar148 = ZEXT3264(local_4680);
        auVar70 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar72);
        local_59c0._0_4_ =
             (uint)(local_5f24 & 1) * auVar70._0_4_ |
             (uint)!(bool)(local_5f24 & 1) * local_4680._0_4_;
        bVar62 = (bool)((byte)(uVar63 >> 1) & 1);
        local_59c0._4_4_ = (uint)bVar62 * auVar70._4_4_ | (uint)!bVar62 * local_4680._4_4_;
        bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
        local_59c0._8_4_ = (uint)bVar62 * auVar70._8_4_ | (uint)!bVar62 * local_4680._8_4_;
        bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
        local_59c0._12_4_ = (uint)bVar62 * auVar70._12_4_ | (uint)!bVar62 * local_4680._12_4_;
        bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
        local_59c0._16_4_ = (uint)bVar62 * auVar70._16_4_ | (uint)!bVar62 * local_4680._16_4_;
        bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
        local_59c0._20_4_ = (uint)bVar62 * auVar70._20_4_ | (uint)!bVar62 * local_4680._20_4_;
        bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
        local_59c0._24_4_ = (uint)bVar62 * auVar70._24_4_ | (uint)!bVar62 * local_4680._24_4_;
        bVar62 = SUB81(uVar63 >> 7,0);
        local_59c0._28_4_ = (uint)bVar62 * auVar70._28_4_ | (uint)!bVar62 * local_4680._28_4_;
        auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar147 = ZEXT3264(auVar70);
        local_5ea4 = (undefined4)uVar63;
        auVar72 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar72);
        bVar62 = (bool)((byte)(uVar63 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar63 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar63 >> 4) & 1);
        bVar17 = (bool)((byte)(uVar63 >> 5) & 1);
        bVar18 = (bool)((byte)(uVar63 >> 6) & 1);
        bVar21 = SUB81(uVar63 >> 7,0);
        local_59a0 = (uint)(local_5f24 & 1) * auVar72._0_4_ |
                     (uint)!(bool)(local_5f24 & 1) * auVar70._0_4_;
        uStack_599c = (uint)bVar62 * auVar72._4_4_ | (uint)!bVar62 * auVar70._4_4_;
        uStack_5998 = (uint)bVar14 * auVar72._8_4_ | (uint)!bVar14 * auVar70._8_4_;
        uStack_5994 = (uint)bVar15 * auVar72._12_4_ | (uint)!bVar15 * auVar70._12_4_;
        uStack_5990 = (uint)bVar16 * auVar72._16_4_ | (uint)!bVar16 * auVar70._16_4_;
        uStack_598c = (uint)bVar17 * auVar72._20_4_ | (uint)!bVar17 * auVar70._20_4_;
        uStack_5988 = (uint)bVar18 * auVar72._24_4_ | (uint)!bVar18 * auVar70._24_4_;
        uStack_5984 = (uint)bVar21 * auVar72._28_4_ | (uint)!bVar21 * auVar70._28_4_;
        local_5f24 = ~local_5f24;
        local_5da8 = This;
        local_5db0 = (BVH *)This->ptr;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar63 = 7;
        }
        else {
          uVar63 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5e20 = ray + 0x100;
        puVar57 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar53 = (undefined1 (*) [32])local_4640;
        local_4660 = local_59c0;
        local_5e28 = (undefined1 (*) [32])&local_5be0;
        auVar70 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar149 = ZEXT3264(auVar70);
        auVar64 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
        auVar150 = ZEXT1664(auVar64);
        local_5e08 = uVar63;
LAB_007d114e:
        do {
          auVar70 = auVar147._0_32_;
          auVar74._4_4_ = uStack_599c;
          auVar74._0_4_ = local_59a0;
          auVar74._8_4_ = uStack_5998;
          auVar74._12_4_ = uStack_5994;
          auVar74._16_4_ = uStack_5990;
          auVar74._20_4_ = uStack_598c;
          auVar74._24_4_ = uStack_5988;
          auVar74._28_4_ = uStack_5984;
          do {
            root.ptr = puVar57[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_007d2459;
            puVar57 = puVar57 + -1;
            _local_5e60 = pauVar53[-1];
            auVar98 = ZEXT3264(_local_5e60);
            pauVar53 = pauVar53 + -1;
            uVar58 = vcmpps_avx512vl(_local_5e60,auVar74,1);
          } while ((char)uVar58 == '\0');
          uVar60 = (undefined4)uVar58;
          if (uVar63 < (uint)POPCOUNT(uVar60)) {
LAB_007d1196:
            do {
              uVar58 = 8;
              auVar70 = auVar147._0_32_;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_007d2459;
                auVar86._4_4_ = uStack_599c;
                auVar86._0_4_ = local_59a0;
                auVar86._8_4_ = uStack_5998;
                auVar86._12_4_ = uStack_5994;
                auVar86._16_4_ = uStack_5990;
                auVar86._20_4_ = uStack_598c;
                auVar86._24_4_ = uStack_5988;
                auVar86._28_4_ = uStack_5984;
                uVar25 = vcmpps_avx512vl(auVar98._0_32_,auVar86,9);
                if ((char)uVar25 != '\0') {
                  local_5da0 = (ulong)((uint)root.ptr & 0xf) - 8;
                  bVar51 = local_5f24;
                  if (local_5da0 != 0) {
                    uVar58 = root.ptr & 0xfffffffffffffff0;
                    bVar51 = ~local_5f24;
                    lVar52 = 0;
                    do {
                      local_5d98 = lVar52;
                      lVar52 = lVar52 * 0x90;
                      auVar64._8_8_ = 0;
                      auVar64._0_8_ = *(ulong *)(uVar58 + 0x40 + lVar52);
                      auVar65._8_8_ = 0;
                      auVar65._0_8_ = *(ulong *)(uVar58 + 0x48 + lVar52);
                      uVar54 = vpcmpub_avx512vl(auVar64,auVar65,2);
                      if ((char)uVar54 != '\0') {
                        lVar52 = lVar52 + uVar58;
                        uVar54 = uVar54 & 0xff;
                        local_5d90 = lVar52;
                        do {
                          lVar56 = 0;
                          for (uVar49 = uVar54; (uVar49 & 1) == 0;
                              uVar49 = uVar49 >> 1 | 0x8000000000000000) {
                            lVar56 = lVar56 + 1;
                          }
                          auVar66._8_8_ = 0;
                          auVar66._0_8_ = *(ulong *)(lVar52 + 0x40);
                          auVar70 = vpmovzxbd_avx2(auVar66);
                          auVar70 = vcvtdq2ps_avx(auVar70);
                          uVar60 = *(undefined4 *)(lVar52 + 0x7c);
                          auVar92._4_4_ = uVar60;
                          auVar92._0_4_ = uVar60;
                          auVar92._8_4_ = uVar60;
                          auVar92._12_4_ = uVar60;
                          auVar92._16_4_ = uVar60;
                          auVar92._20_4_ = uVar60;
                          auVar92._24_4_ = uVar60;
                          auVar92._28_4_ = uVar60;
                          uVar60 = *(undefined4 *)(lVar52 + 0x70);
                          auVar100._4_4_ = uVar60;
                          auVar100._0_4_ = uVar60;
                          auVar100._8_4_ = uVar60;
                          auVar100._12_4_ = uVar60;
                          auVar100._16_4_ = uVar60;
                          auVar100._20_4_ = uVar60;
                          auVar100._24_4_ = uVar60;
                          auVar100._28_4_ = uVar60;
                          auVar64 = vfmadd213ps_fma(auVar70,auVar92,auVar100);
                          auVar70 = ZEXT1632(auVar64);
                          local_5cc0[0] = (RTCHitN)auVar70[0];
                          local_5cc0[1] = (RTCHitN)auVar70[1];
                          local_5cc0[2] = (RTCHitN)auVar70[2];
                          local_5cc0[3] = (RTCHitN)auVar70[3];
                          local_5cc0[4] = (RTCHitN)auVar70[4];
                          local_5cc0[5] = (RTCHitN)auVar70[5];
                          local_5cc0[6] = (RTCHitN)auVar70[6];
                          local_5cc0[7] = (RTCHitN)auVar70[7];
                          local_5cc0[8] = (RTCHitN)auVar70[8];
                          local_5cc0[9] = (RTCHitN)auVar70[9];
                          local_5cc0[10] = (RTCHitN)auVar70[10];
                          local_5cc0[0xb] = (RTCHitN)auVar70[0xb];
                          local_5cc0[0xc] = (RTCHitN)auVar70[0xc];
                          local_5cc0[0xd] = (RTCHitN)auVar70[0xd];
                          local_5cc0[0xe] = (RTCHitN)auVar70[0xe];
                          local_5cc0[0xf] = (RTCHitN)auVar70[0xf];
                          local_5cc0[0x10] = (RTCHitN)auVar70[0x10];
                          local_5cc0[0x11] = (RTCHitN)auVar70[0x11];
                          local_5cc0[0x12] = (RTCHitN)auVar70[0x12];
                          local_5cc0[0x13] = (RTCHitN)auVar70[0x13];
                          local_5cc0[0x14] = (RTCHitN)auVar70[0x14];
                          local_5cc0[0x15] = (RTCHitN)auVar70[0x15];
                          local_5cc0[0x16] = (RTCHitN)auVar70[0x16];
                          local_5cc0[0x17] = (RTCHitN)auVar70[0x17];
                          local_5cc0[0x18] = (RTCHitN)auVar70[0x18];
                          local_5cc0[0x19] = (RTCHitN)auVar70[0x19];
                          local_5cc0[0x1a] = (RTCHitN)auVar70[0x1a];
                          local_5cc0[0x1b] = (RTCHitN)auVar70[0x1b];
                          local_5cc0[0x1c] = (RTCHitN)auVar70[0x1c];
                          local_5cc0[0x1d] = (RTCHitN)auVar70[0x1d];
                          local_5cc0[0x1e] = (RTCHitN)auVar70[0x1e];
                          local_5cc0[0x1f] = (RTCHitN)auVar70[0x1f];
                          auVar69._8_8_ = 0;
                          auVar69._0_8_ = *(ulong *)(lVar52 + 0x48);
                          auVar70 = vpmovzxbd_avx2(auVar69);
                          auVar70 = vcvtdq2ps_avx(auVar70);
                          auVar64 = vfmadd213ps_fma(auVar70,auVar92,auVar100);
                          local_5980 = ZEXT1632(auVar64);
                          auVar68._8_8_ = 0;
                          auVar68._0_8_ = *(ulong *)(lVar52 + 0x50);
                          auVar70 = vpmovzxbd_avx2(auVar68);
                          uVar60 = *(undefined4 *)(lVar52 + 0x80);
                          auVar93._4_4_ = uVar60;
                          auVar93._0_4_ = uVar60;
                          auVar93._8_4_ = uVar60;
                          auVar93._12_4_ = uVar60;
                          auVar93._16_4_ = uVar60;
                          auVar93._20_4_ = uVar60;
                          auVar93._24_4_ = uVar60;
                          auVar93._28_4_ = uVar60;
                          auVar70 = vcvtdq2ps_avx(auVar70);
                          uVar60 = *(undefined4 *)(lVar52 + 0x74);
                          auVar101._4_4_ = uVar60;
                          auVar101._0_4_ = uVar60;
                          auVar101._8_4_ = uVar60;
                          auVar101._12_4_ = uVar60;
                          auVar101._16_4_ = uVar60;
                          auVar101._20_4_ = uVar60;
                          auVar101._24_4_ = uVar60;
                          auVar101._28_4_ = uVar60;
                          auVar64 = vfmadd213ps_fma(auVar70,auVar93,auVar101);
                          auVar70 = ZEXT1632(auVar64);
                          local_5ea0.valid = (int *)auVar70._0_8_;
                          local_5ea0.geometryUserPtr = (void *)auVar70._8_8_;
                          local_5ea0.context = (RTCRayQueryContext *)auVar70._16_8_;
                          local_5ea0.ray = (RTCRayN *)auVar70._24_8_;
                          auVar145._8_8_ = 0;
                          auVar145._0_8_ = *(ulong *)(lVar52 + 0x58);
                          auVar70 = vpmovzxbd_avx2(auVar145);
                          auVar70 = vcvtdq2ps_avx(auVar70);
                          auVar64 = vfmadd213ps_fma(auVar70,auVar93,auVar101);
                          local_5e00 = ZEXT1632(auVar64);
                          auVar67._8_8_ = 0;
                          auVar67._0_8_ = *(ulong *)(lVar52 + 0x60);
                          auVar70 = vpmovzxbd_avx2(auVar67);
                          uVar60 = *(undefined4 *)(lVar52 + 0x84);
                          auVar94._4_4_ = uVar60;
                          auVar94._0_4_ = uVar60;
                          auVar94._8_4_ = uVar60;
                          auVar94._12_4_ = uVar60;
                          auVar94._16_4_ = uVar60;
                          auVar94._20_4_ = uVar60;
                          auVar94._24_4_ = uVar60;
                          auVar94._28_4_ = uVar60;
                          uVar60 = *(undefined4 *)(lVar52 + 0x78);
                          auVar102._4_4_ = uVar60;
                          auVar102._0_4_ = uVar60;
                          auVar102._8_4_ = uVar60;
                          auVar102._12_4_ = uVar60;
                          auVar102._16_4_ = uVar60;
                          auVar102._20_4_ = uVar60;
                          auVar102._24_4_ = uVar60;
                          auVar102._28_4_ = uVar60;
                          auVar70 = vcvtdq2ps_avx(auVar70);
                          auVar64 = vfmadd213ps_fma(auVar70,auVar94,auVar102);
                          local_5d00 = ZEXT1632(auVar64);
                          auVar6._8_8_ = 0;
                          auVar6._0_8_ = *(ulong *)(lVar52 + 0x68);
                          auVar70 = vpmovzxbd_avx2(auVar6);
                          auVar70 = vcvtdq2ps_avx(auVar70);
                          auVar64 = vfmadd213ps_fma(auVar70,auVar94,auVar102);
                          local_5d20 = ZEXT1632(auVar64);
                          auVar40._4_4_ = fStack_5a7c;
                          auVar40._0_4_ = local_5a80;
                          auVar40._8_4_ = fStack_5a78;
                          auVar40._12_4_ = fStack_5a74;
                          auVar40._16_4_ = fStack_5a70;
                          auVar40._20_4_ = fStack_5a6c;
                          auVar40._24_4_ = fStack_5a68;
                          auVar40._28_4_ = uStack_5a64;
                          uVar49 = (ulong)(uint)((int)lVar56 * 4);
                          uVar60 = *(undefined4 *)(local_5cc0 + uVar49);
                          auVar108._4_4_ = uVar60;
                          auVar108._0_4_ = uVar60;
                          auVar108._8_4_ = uVar60;
                          auVar108._12_4_ = uVar60;
                          auVar108._16_4_ = uVar60;
                          auVar108._20_4_ = uVar60;
                          auVar108._24_4_ = uVar60;
                          auVar108._28_4_ = uVar60;
                          auVar64 = vfmsub132ps_fma(auVar108,auVar40,local_5ae0);
                          auVar41._4_4_ = fStack_5a5c;
                          auVar41._0_4_ = local_5a60;
                          auVar41._8_4_ = fStack_5a58;
                          auVar41._12_4_ = fStack_5a54;
                          auVar41._16_4_ = fStack_5a50;
                          auVar41._20_4_ = fStack_5a4c;
                          auVar41._24_4_ = fStack_5a48;
                          auVar41._28_4_ = uStack_5a44;
                          uVar60 = *(undefined4 *)((long)&local_5ea0.valid + uVar49);
                          auVar117._4_4_ = uVar60;
                          auVar117._0_4_ = uVar60;
                          auVar117._8_4_ = uVar60;
                          auVar117._12_4_ = uVar60;
                          auVar117._16_4_ = uVar60;
                          auVar117._20_4_ = uVar60;
                          auVar117._24_4_ = uVar60;
                          auVar117._28_4_ = uVar60;
                          uVar60 = *(undefined4 *)(local_5d00 + uVar49);
                          auVar120._4_4_ = uVar60;
                          auVar120._0_4_ = uVar60;
                          auVar120._8_4_ = uVar60;
                          auVar120._12_4_ = uVar60;
                          auVar120._16_4_ = uVar60;
                          auVar120._20_4_ = uVar60;
                          auVar120._24_4_ = uVar60;
                          auVar120._28_4_ = uVar60;
                          auVar65 = vfmsub132ps_fma(auVar117,auVar41,local_5ac0);
                          auVar66 = vfmsub132ps_fma(auVar120,local_5a40,local_5aa0);
                          uVar60 = *(undefined4 *)(local_5980 + uVar49);
                          auVar87._4_4_ = uVar60;
                          auVar87._0_4_ = uVar60;
                          auVar87._8_4_ = uVar60;
                          auVar87._12_4_ = uVar60;
                          auVar87._16_4_ = uVar60;
                          auVar87._20_4_ = uVar60;
                          auVar87._24_4_ = uVar60;
                          auVar87._28_4_ = uVar60;
                          auVar75 = vfmsub132ps_avx512vl(local_5ae0,auVar40,auVar87);
                          uVar60 = *(undefined4 *)(local_5e00 + uVar49);
                          auVar27._4_4_ = uVar60;
                          auVar27._0_4_ = uVar60;
                          auVar27._8_4_ = uVar60;
                          auVar27._12_4_ = uVar60;
                          auVar27._16_4_ = uVar60;
                          auVar27._20_4_ = uVar60;
                          auVar27._24_4_ = uVar60;
                          auVar27._28_4_ = uVar60;
                          auVar71 = vfmsub132ps_avx512vl(local_5ac0,auVar41,auVar27);
                          uVar60 = *(undefined4 *)(local_5d20 + uVar49);
                          auVar28._4_4_ = uVar60;
                          auVar28._0_4_ = uVar60;
                          auVar28._8_4_ = uVar60;
                          auVar28._12_4_ = uVar60;
                          auVar28._16_4_ = uVar60;
                          auVar28._20_4_ = uVar60;
                          auVar28._24_4_ = uVar60;
                          auVar28._28_4_ = uVar60;
                          auVar73 = vfmsub132ps_avx512vl(local_5aa0,local_5a40,auVar28);
                          auVar70 = vpminsd_avx2(ZEXT1632(auVar64),auVar75);
                          auVar72 = vpminsd_avx2(ZEXT1632(auVar65),auVar71);
                          auVar70 = vpmaxsd_avx2(auVar70,auVar72);
                          auVar72 = vpminsd_avx2(ZEXT1632(auVar66),auVar73);
                          auVar70 = vpmaxsd_avx2(auVar70,auVar72);
                          auVar72 = vpmaxsd_avx2(ZEXT1632(auVar64),auVar75);
                          auVar75 = vpmaxsd_avx2(ZEXT1632(auVar65),auVar71);
                          auVar75 = vpminsd_avx2(auVar72,auVar75);
                          auVar72 = vpmaxsd_avx2(ZEXT1632(auVar66),auVar73);
                          auVar72 = vpminsd_avx2(auVar75,auVar72);
                          auVar70 = vpmaxsd_avx2(auVar70,local_59c0);
                          auVar42._4_4_ = uStack_599c;
                          auVar42._0_4_ = local_59a0;
                          auVar42._8_4_ = uStack_5998;
                          auVar42._12_4_ = uStack_5994;
                          auVar42._16_4_ = uStack_5990;
                          auVar42._20_4_ = uStack_598c;
                          auVar42._24_4_ = uStack_5988;
                          auVar42._28_4_ = uStack_5984;
                          auVar72 = vpminsd_avx2(auVar72,auVar42);
                          uVar25 = vpcmpd_avx512vl(auVar70,auVar72,2);
                          if ((bVar51 & (byte)uVar25) == 0) {
                            bVar62 = false;
                          }
                          else {
                            local_5d88 = uVar54;
                            uVar7 = *(ushort *)(lVar52 + lVar56 * 8);
                            uVar8 = *(ushort *)(lVar52 + 2 + lVar56 * 8);
                            pGVar10 = (context->scene->geometries).items[*(uint *)(lVar52 + 0x88)].
                                      ptr;
                            local_5e10 = *(long *)&pGVar10->field_0x58;
                            lVar11 = *(long *)&pGVar10[1].time_range.upper;
                            local_5e18 = (ulong)*(uint *)(lVar52 + 4 + lVar56 * 8) *
                                         pGVar10[1].super_RefCount.refCounter.
                                         super___atomic_base<unsigned_long>._M_i;
                            local_5f04 = uVar7 & 0x7fff;
                            local_5f08 = uVar8 & 0x7fff;
                            uVar9 = *(uint *)(local_5e10 + 4 + local_5e18);
                            uVar63 = (ulong)uVar9;
                            uVar49 = (ulong)(uVar9 * local_5f08 +
                                            *(int *)(local_5e10 + local_5e18) + local_5f04);
                            p_Var12 = pGVar10[1].intersectionFilterN;
                            puVar2 = (undefined8 *)(lVar11 + (uVar49 + 1) * (long)p_Var12);
                            local_5980._16_8_ = *puVar2;
                            local_5980._24_8_ = puVar2[1];
                            lVar52 = uVar49 + uVar63;
                            puVar2 = (undefined8 *)(lVar11 + lVar52 * (long)p_Var12);
                            local_5950 = *puVar2;
                            uStack_5948 = puVar2[1];
                            lVar56 = uVar49 + uVar63 + 1;
                            puVar2 = (undefined8 *)(lVar11 + lVar56 * (long)p_Var12);
                            local_5960 = *puVar2;
                            uStack_5958 = puVar2[1];
                            uVar54 = (ulong)(-1 < (short)uVar7);
                            puVar2 = (undefined8 *)(lVar11 + (uVar49 + uVar54 + 1) * (long)p_Var12);
                            lVar59 = uVar54 + lVar56;
                            puVar3 = (undefined8 *)(lVar11 + lVar59 * (long)p_Var12);
                            local_5920 = *puVar3;
                            uStack_5918 = puVar3[1];
                            if ((short)uVar8 < 0) {
                              uVar63 = 0;
                            }
                            puVar3 = (undefined8 *)(lVar11 + (lVar52 + uVar63) * (long)p_Var12);
                            puVar4 = (undefined8 *)(lVar11 + (lVar56 + uVar63) * (long)p_Var12);
                            local_58e0 = *puVar4;
                            uStack_58d8 = puVar4[1];
                            puVar4 = (undefined8 *)(lVar11 + (uVar63 + lVar59) * (long)p_Var12);
                            auVar64 = vpbroadcastd_avx512vl();
                            auVar98 = ZEXT1664(auVar64);
                            local_5980._0_16_ =
                                 *(undefined1 (*) [16])(lVar11 + (long)p_Var12 * uVar49);
                            local_5940 = local_5980._16_8_;
                            uStack_5938 = local_5980._24_8_;
                            local_5930 = *puVar2;
                            uStack_5928 = puVar2[1];
                            local_5910 = local_5960;
                            uStack_5908 = uStack_5958;
                            local_5900 = local_5950;
                            uStack_58f8 = uStack_5948;
                            local_58f0 = local_5960;
                            uStack_58e8 = uStack_5958;
                            local_58d0 = *puVar3;
                            uStack_58c8 = puVar3[1];
                            local_58c0 = local_5960;
                            uStack_58b8 = uStack_5958;
                            local_58b0 = local_5920;
                            uStack_58a8 = uStack_5918;
                            local_58a0 = *puVar4;
                            uStack_5898 = puVar4[1];
                            local_5890 = local_58e0;
                            uStack_5888 = uStack_58d8;
                            auVar64 = vpbroadcastd_avx512vl();
                            auVar151 = ZEXT1664(auVar64);
                            pfVar61 = (float *)&uStack_5948;
                            uVar63 = 0;
                            bVar55 = bVar51;
                            do {
                              auVar65 = auVar150._0_16_;
                              fVar124 = pfVar61[-0xe];
                              auVar95._4_4_ = fVar124;
                              auVar95._0_4_ = fVar124;
                              auVar95._8_4_ = fVar124;
                              auVar95._12_4_ = fVar124;
                              auVar95._16_4_ = fVar124;
                              auVar95._20_4_ = fVar124;
                              auVar95._24_4_ = fVar124;
                              auVar95._28_4_ = fVar124;
                              fVar126 = pfVar61[-0xd];
                              auVar114._4_4_ = fVar126;
                              auVar114._0_4_ = fVar126;
                              auVar114._8_4_ = fVar126;
                              auVar114._12_4_ = fVar126;
                              auVar114._16_4_ = fVar126;
                              auVar114._20_4_ = fVar126;
                              auVar114._24_4_ = fVar126;
                              auVar114._28_4_ = fVar126;
                              fVar127 = pfVar61[-0xc];
                              auVar122._4_4_ = fVar127;
                              auVar122._0_4_ = fVar127;
                              auVar122._8_4_ = fVar127;
                              auVar122._12_4_ = fVar127;
                              auVar122._16_4_ = fVar127;
                              auVar122._20_4_ = fVar127;
                              auVar122._24_4_ = fVar127;
                              auVar122._28_4_ = fVar127;
                              local_5840 = pfVar61[-10];
                              local_5860 = pfVar61[-9];
                              local_5880 = pfVar61[-8];
                              auVar76 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar61[-6]));
                              auVar77 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar61[-5]));
                              auVar78 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar61[-4]));
                              local_5ee0 = pfVar61[-2];
                              local_5e60._4_4_ = pfVar61[-1];
                              local_5de0 = *pfVar61;
                              auVar64 = vmovdqa64_avx512vl(auVar151._0_16_);
                              local_5d00._0_16_ = auVar64;
                              auVar64 = vmovdqa64_avx512vl(auVar98._0_16_);
                              local_5d20._0_16_ = auVar64;
                              fStack_583c = local_5840;
                              fStack_5838 = local_5840;
                              fStack_5834 = local_5840;
                              fStack_5830 = local_5840;
                              fStack_582c = local_5840;
                              fStack_5828 = local_5840;
                              fStack_5824 = local_5840;
                              fVar130 = fVar124 - local_5840;
                              auVar125._4_4_ = fVar130;
                              auVar125._0_4_ = fVar130;
                              auVar125._8_4_ = fVar130;
                              auVar125._12_4_ = fVar130;
                              auVar125._16_4_ = fVar130;
                              auVar125._20_4_ = fVar130;
                              auVar125._24_4_ = fVar130;
                              auVar125._28_4_ = fVar130;
                              fStack_585c = local_5860;
                              fStack_5858 = local_5860;
                              fStack_5854 = local_5860;
                              fStack_5850 = local_5860;
                              fStack_584c = local_5860;
                              fStack_5848 = local_5860;
                              fStack_5844 = local_5860;
                              fVar128 = fVar126 - local_5860;
                              auVar133._4_4_ = fVar128;
                              auVar133._0_4_ = fVar128;
                              auVar133._8_4_ = fVar128;
                              auVar133._12_4_ = fVar128;
                              auVar133._16_4_ = fVar128;
                              auVar133._20_4_ = fVar128;
                              auVar133._24_4_ = fVar128;
                              auVar133._28_4_ = fVar128;
                              fStack_587c = local_5880;
                              fStack_5878 = local_5880;
                              fStack_5874 = local_5880;
                              fStack_5870 = local_5880;
                              fStack_586c = local_5880;
                              fStack_5868 = local_5880;
                              fStack_5864 = local_5880;
                              fVar129 = fVar127 - local_5880;
                              auVar141._4_4_ = fVar129;
                              auVar141._0_4_ = fVar129;
                              auVar141._8_4_ = fVar129;
                              auVar141._12_4_ = fVar129;
                              auVar141._16_4_ = fVar129;
                              auVar141._20_4_ = fVar129;
                              auVar141._24_4_ = fVar129;
                              auVar141._28_4_ = fVar129;
                              auVar79 = vbroadcastss_avx512vl(ZEXT416((uint)(local_5ee0 - fVar124)))
                              ;
                              local_5e60._0_4_ = local_5e60._4_4_;
                              fStack_5e58 = (float)local_5e60._4_4_;
                              fStack_5e54 = (float)local_5e60._4_4_;
                              fStack_5e50 = (float)local_5e60._4_4_;
                              fStack_5e4c = (float)local_5e60._4_4_;
                              fStack_5e48 = (float)local_5e60._4_4_;
                              fStack_5e44 = (float)local_5e60._4_4_;
                              auVar80 = vbroadcastss_avx512vl
                                                  (ZEXT416((uint)((float)local_5e60._4_4_ - fVar126)
                                                          ));
                              fStack_5ddc = local_5de0;
                              fStack_5dd8 = local_5de0;
                              fStack_5dd4 = local_5de0;
                              fStack_5dd0 = local_5de0;
                              fStack_5dcc = local_5de0;
                              fStack_5dc8 = local_5de0;
                              fStack_5dc4 = local_5de0;
                              auVar81 = vbroadcastss_avx512vl(ZEXT416((uint)(local_5de0 - fVar127)))
                              ;
                              auVar64 = auVar81._0_16_;
                              fVar128 = fVar128 * (local_5de0 - fVar127);
                              auVar118._4_4_ = fVar128;
                              auVar118._0_4_ = fVar128;
                              auVar118._8_4_ = fVar128;
                              auVar118._12_4_ = fVar128;
                              auVar118._16_4_ = fVar128;
                              auVar118._20_4_ = fVar128;
                              auVar118._24_4_ = fVar128;
                              auVar118._28_4_ = fVar128;
                              auVar82 = vfmsub231ps_avx512vl(auVar118,auVar80,auVar141);
                              fVar129 = fVar129 * (local_5ee0 - fVar124);
                              auVar119._4_4_ = fVar129;
                              auVar119._0_4_ = fVar129;
                              auVar119._8_4_ = fVar129;
                              auVar119._12_4_ = fVar129;
                              auVar119._16_4_ = fVar129;
                              auVar119._20_4_ = fVar129;
                              auVar119._24_4_ = fVar129;
                              auVar119._28_4_ = fVar129;
                              auVar83 = vfmsub231ps_avx512vl(auVar119,auVar81,auVar125);
                              fVar130 = ((float)local_5e60._4_4_ - fVar126) * fVar130;
                              auVar121._4_4_ = fVar130;
                              auVar121._0_4_ = fVar130;
                              auVar121._8_4_ = fVar130;
                              auVar121._12_4_ = fVar130;
                              auVar121._16_4_ = fVar130;
                              auVar121._20_4_ = fVar130;
                              auVar121._24_4_ = fVar130;
                              auVar121._28_4_ = fVar130;
                              auVar105 = ZEXT3264(*(undefined1 (*) [32])ray);
                              auVar107 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x20));
                              auVar112 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x40));
                              auVar70 = *(undefined1 (*) [32])(ray + 0x80);
                              auVar84 = vfmsub231ps_avx512vl(auVar121,auVar79,auVar133);
                              auVar71 = vsubps_avx(auVar95,*(undefined1 (*) [32])ray);
                              auVar73 = vsubps_avx(auVar114,*(undefined1 (*) [32])(ray + 0x20));
                              auVar74 = vsubps_avx(auVar122,*(undefined1 (*) [32])(ray + 0x40));
                              uVar9 = auVar74._28_4_;
                              auVar144 = ZEXT436(uVar9);
                              auVar143 = ZEXT436(uVar9);
                              auVar72 = *(undefined1 (*) [32])(ray + 0xa0);
                              auVar75 = *(undefined1 (*) [32])(ray + 0xc0);
                              auVar85 = vmulps_avx512vl(auVar72,auVar74);
                              auVar85 = vfmsub231ps_avx512vl(auVar85,auVar73,auVar75);
                              auVar86 = vmulps_avx512vl(auVar75,auVar71);
                              auVar86 = vfmsub231ps_avx512vl(auVar86,auVar74,auVar70);
                              auVar87 = vmulps_avx512vl(auVar70,auVar73);
                              auVar87 = vfmsub231ps_avx512vl(auVar87,auVar71,auVar72);
                              auVar81 = vmulps_avx512vl(auVar81,auVar87);
                              auVar80 = vfmadd231ps_avx512vl(auVar81,auVar86,auVar80);
                              auVar81 = vmulps_avx512vl(auVar84,auVar75);
                              auVar81 = vfmadd231ps_avx512vl(auVar81,auVar83,auVar72);
                              auVar81 = vfmadd231ps_avx512vl(auVar81,auVar82,auVar70);
                              auVar79 = vfmadd231ps_avx512vl(auVar80,auVar85,auVar79);
                              vandps_avx512vl(auVar81,auVar149._0_32_);
                              auVar80 = vxorps_avx512vl(auVar79,auVar79);
                              uVar25 = vcmpps_avx512vl(auVar80,auVar150._0_32_,5);
                              bVar50 = (byte)uVar25 & bVar55;
                              fStack_5edc = local_5ee0;
                              fStack_5ed8 = local_5ee0;
                              fStack_5ed4 = local_5ee0;
                              fStack_5ed0 = local_5ee0;
                              fStack_5ecc = local_5ee0;
                              fStack_5ec8 = local_5ee0;
                              fStack_5ec4 = local_5ee0;
                              if (bVar50 != 0) {
                                auVar87 = vmulps_avx512vl(auVar141,auVar87);
                                auVar86 = vfmadd213ps_avx512vl(auVar86,auVar133,auVar87);
                                auVar85 = vfmadd213ps_avx512vl(auVar85,auVar125,auVar86);
                                auVar86 = vxorps_avx512vl(auVar79,auVar85);
                                uVar25 = vcmpps_avx512vl(auVar86,auVar150._0_32_,5);
                                bVar50 = bVar50 & (byte)uVar25;
                                if (bVar50 != 0) {
                                  vandps_avx512vl(auVar81,auVar146._0_32_);
                                  auVar87 = vsubps_avx(auVar86,auVar80);
                                  uVar25 = vcmpps_avx512vl(auVar87,auVar86,5);
                                  bVar50 = bVar50 & (byte)uVar25;
                                  if (bVar50 != 0) {
                                    local_5d80 = auVar78;
                                    local_5d60 = auVar77;
                                    local_5d40 = auVar76;
                                    local_5f00 = vmovdqa64_avx512vl(auVar151._0_16_);
                                    local_5ef0 = vmovdqa64_avx512vl(auVar98._0_16_);
                                    auVar69 = vxorps_avx512vl(auVar85._0_16_,auVar85._0_16_);
                                    auVar31._4_4_ = auVar84._4_4_ * auVar74._4_4_;
                                    auVar31._0_4_ = auVar84._0_4_ * auVar74._0_4_;
                                    auVar31._8_4_ = auVar84._8_4_ * auVar74._8_4_;
                                    auVar31._12_4_ = auVar84._12_4_ * auVar74._12_4_;
                                    auVar31._16_4_ = auVar84._16_4_ * auVar74._16_4_;
                                    auVar31._20_4_ = auVar84._20_4_ * auVar74._20_4_;
                                    auVar31._24_4_ = auVar84._24_4_ * auVar74._24_4_;
                                    auVar31._28_4_ = auVar87._28_4_;
                                    auVar66 = vfmadd213ps_fma(auVar73,auVar83,auVar31);
                                    auVar66 = vfmadd213ps_fma(auVar71,auVar82,ZEXT1632(auVar66));
                                    auVar71 = vxorps_avx512vl(auVar79,ZEXT1632(auVar66));
                                    fVar124 = auVar86._0_4_;
                                    auVar139._0_4_ = fVar124 * *(float *)(ray + 0x60);
                                    fVar126 = auVar86._4_4_;
                                    auVar139._4_4_ = fVar126 * *(float *)(ray + 100);
                                    fVar127 = auVar86._8_4_;
                                    auVar139._8_4_ = fVar127 * *(float *)(ray + 0x68);
                                    fVar128 = auVar86._12_4_;
                                    auVar139._12_4_ = fVar128 * *(float *)(ray + 0x6c);
                                    fVar129 = auVar86._16_4_;
                                    auVar139._16_4_ = fVar129 * *(float *)(ray + 0x70);
                                    fVar130 = auVar86._20_4_;
                                    auVar139._20_4_ = fVar130 * *(float *)(ray + 0x74);
                                    fVar131 = auVar86._24_4_;
                                    auVar139._24_4_ = fVar131 * *(float *)(ray + 0x78);
                                    auVar139._28_4_ = 0;
                                    local_5ce0 = *(float *)(ray + 0x100);
                                    fStack_5cdc = *(float *)(ray + 0x104);
                                    fStack_5cd8 = *(float *)(ray + 0x108);
                                    fStack_5cd4 = *(float *)(ray + 0x10c);
                                    fStack_5cd0 = *(float *)(ray + 0x110);
                                    fStack_5ccc = *(float *)(ray + 0x114);
                                    fStack_5cc8 = *(float *)(ray + 0x118);
                                    iStack_5cc4 = *(int *)(ray + 0x11c);
                                    auVar32._4_4_ = fVar126 * fStack_5cdc;
                                    auVar32._0_4_ = fVar124 * local_5ce0;
                                    auVar32._8_4_ = fVar127 * fStack_5cd8;
                                    auVar32._12_4_ = fVar128 * fStack_5cd4;
                                    auVar32._16_4_ = fVar129 * fStack_5cd0;
                                    auVar32._20_4_ = fVar130 * fStack_5ccc;
                                    auVar32._24_4_ = fVar131 * fStack_5cc8;
                                    auVar32._28_4_ = iStack_5cc4;
                                    uVar25 = vcmpps_avx512vl(auVar71,auVar32,2);
                                    uVar26 = vcmpps_avx512vl(auVar139,auVar71,1);
                                    bVar50 = bVar50 & (byte)uVar25 & (byte)uVar26;
                                    if (bVar50 == 0) {
LAB_007d1d14:
                                      auVar76 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                      auVar71 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar65 = vxorps_avx512vl(auVar65,auVar65);
                                      auVar66 = vmovdqa64_avx512vl(local_5ef0);
                                      auVar69 = vmovdqa64_avx512vl(local_5f00);
                                      auVar143 = ZEXT436(uVar9);
                                    }
                                    else {
                                      uVar25 = vcmpps_avx512vl(auVar81,ZEXT1632(auVar69),4);
                                      bVar50 = bVar50 & (byte)uVar25;
                                      if (bVar50 == 0) goto LAB_007d1d14;
                                      local_5eb0 = (context->scene->geometries).items
                                                   [*(uint *)(local_5d00 + uVar63 * 4)].ptr;
                                      uVar5 = local_5eb0->mask;
                                      auVar140._4_4_ = uVar5;
                                      auVar140._0_4_ = uVar5;
                                      auVar140._8_4_ = uVar5;
                                      auVar140._12_4_ = uVar5;
                                      auVar140._16_4_ = uVar5;
                                      auVar140._20_4_ = uVar5;
                                      auVar140._24_4_ = uVar5;
                                      auVar140._28_4_ = uVar5;
                                      uVar25 = vptestmd_avx512vl(auVar140,*(undefined1 (*) [32])
                                                                           (ray + 0x120));
                                      bVar47 = (byte)uVar25 & bVar50;
                                      if (bVar47 == 0) goto LAB_007d1d14;
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (local_5eb0->occlusionFilterN != (RTCFilterFunctionN)0x0))
                                      {
                                        auVar145 = auVar146._0_16_;
                                        auVar66 = vcvtsi2ss_avx512f(auVar145,*(ushort *)
                                                                              (local_5e10 + 8 +
                                                                              local_5e18) - 1);
                                        auVar69 = vcvtsi2ss_avx512f(auVar145,*(ushort *)
                                                                              (local_5e10 + 10 +
                                                                              local_5e18) - 1);
                                        auVar68 = vcvtsi2ss_avx512f(auVar145,((uint)uVar63 & 1) +
                                                                             local_5f04);
                                        auVar145 = vcvtsi2ss_avx512f(auVar145,((uint)(uVar63 >> 1) &
                                                                              0x7fffffff) +
                                                                              local_5f08);
                                        local_5c00 = vpbroadcastd_avx512vl();
                                        auVar113._4_12_ = SUB6412(ZEXT1664((undefined1  [16])0x0),4)
                                        ;
                                        auVar113._0_4_ = auVar66._0_4_;
                                        auVar67 = vrcp14ss_avx512f((undefined1  [16])0x0,auVar113);
                                        auVar66 = vfnmadd213ss_fma(auVar66,auVar67,
                                                                   SUB6416(ZEXT464(0x40000000),0));
                                        fVar132 = auVar67._0_4_ * auVar66._0_4_;
                                        fVar99 = auVar68._0_4_;
                                        auVar104._0_4_ = auVar80._0_4_ + fVar124 * fVar99;
                                        auVar104._4_4_ = auVar80._4_4_ + fVar126 * fVar99;
                                        auVar104._8_4_ = auVar80._8_4_ + fVar127 * fVar99;
                                        auVar104._12_4_ = auVar80._12_4_ + fVar128 * fVar99;
                                        auVar104._16_4_ = auVar80._16_4_ + fVar129 * fVar99;
                                        auVar104._20_4_ = auVar80._20_4_ + fVar130 * fVar99;
                                        auVar104._24_4_ = auVar80._24_4_ + fVar131 * fVar99;
                                        auVar104._28_4_ = auVar80._28_4_ + fVar99;
                                        auVar90._4_4_ = fVar132;
                                        auVar90._0_4_ = fVar132;
                                        auVar90._8_4_ = fVar132;
                                        auVar90._12_4_ = fVar132;
                                        auVar90._16_4_ = fVar132;
                                        auVar90._20_4_ = fVar132;
                                        auVar90._24_4_ = fVar132;
                                        auVar90._28_4_ = fVar132;
                                        auVar70 = vmulps_avx512vl(auVar104,auVar90);
                                        bVar62 = (bool)(bVar50 >> 1 & 1);
                                        bVar15 = (bool)(bVar50 >> 2 & 1);
                                        bVar17 = (bool)(bVar50 >> 3 & 1);
                                        bVar21 = (bool)(bVar50 >> 4 & 1);
                                        bVar19 = (bool)(bVar50 >> 5 & 1);
                                        bVar22 = (bool)(bVar50 >> 6 & 1);
                                        auVar89._4_12_ = SUB6412(ZEXT1664((undefined1  [16])0x0),4);
                                        auVar89._0_4_ = auVar69._0_4_;
                                        auVar68 = vrcp14ss_avx512f((undefined1  [16])0x0,auVar89);
                                        auVar66 = vfnmadd213ss_fma(auVar69,auVar68,
                                                                   SUB6416(ZEXT464(0x40000000),0));
                                        fVar132 = auVar68._0_4_ * auVar66._0_4_;
                                        fVar99 = auVar145._0_4_;
                                        auVar97._0_4_ = fVar124 + fVar124 * fVar99;
                                        auVar97._4_4_ = fVar126 + fVar126 * fVar99;
                                        auVar97._8_4_ = fVar127 + fVar127 * fVar99;
                                        auVar97._12_4_ = fVar128 + fVar128 * fVar99;
                                        auVar97._16_4_ = fVar129 + fVar129 * fVar99;
                                        auVar97._20_4_ = fVar130 + fVar130 * fVar99;
                                        auVar97._24_4_ = fVar131 + fVar131 * fVar99;
                                        auVar97._28_4_ = auVar86._28_4_ + fVar99;
                                        auVar91._4_4_ = fVar132;
                                        auVar91._0_4_ = fVar132;
                                        auVar91._8_4_ = fVar132;
                                        auVar91._12_4_ = fVar132;
                                        auVar91._16_4_ = fVar132;
                                        auVar91._20_4_ = fVar132;
                                        auVar91._24_4_ = fVar132;
                                        auVar91._28_4_ = fVar132;
                                        auVar72 = vmulps_avx512vl(auVar97,auVar91);
                                        bVar14 = (bool)(bVar50 >> 1 & 1);
                                        bVar16 = (bool)(bVar50 >> 2 & 1);
                                        bVar18 = (bool)(bVar50 >> 3 & 1);
                                        bVar24 = (bool)(bVar50 >> 4 & 1);
                                        bVar20 = (bool)(bVar50 >> 5 & 1);
                                        bVar23 = (bool)(bVar50 >> 6 & 1);
                                        auVar75 = vrcp14ps_avx512vl(auVar86);
                                        auVar30._8_4_ = 0x3f800000;
                                        auVar30._0_8_ = 0x3f8000003f800000;
                                        auVar30._12_4_ = 0x3f800000;
                                        auVar30._16_4_ = 0x3f800000;
                                        auVar30._20_4_ = 0x3f800000;
                                        auVar30._24_4_ = 0x3f800000;
                                        auVar30._28_4_ = 0x3f800000;
                                        auVar73 = vfnmadd213ps_avx512vl(auVar86,auVar75,auVar30);
                                        auVar66 = vfmadd132ps_fma(auVar73,auVar75,auVar75);
                                        local_5c60._4_4_ =
                                             (float)((uint)bVar62 * auVar70._4_4_ |
                                                    (uint)!bVar62 * (int)auVar80._4_4_) *
                                             auVar66._4_4_;
                                        local_5c60._0_4_ =
                                             (float)((uint)(bVar50 & 1) * auVar70._0_4_ |
                                                    (uint)!(bool)(bVar50 & 1) * (int)auVar80._0_4_)
                                             * auVar66._0_4_;
                                        fStack_5c58 = (float)((uint)bVar15 * auVar70._8_4_ |
                                                             (uint)!bVar15 * (int)auVar80._8_4_) *
                                                      auVar66._8_4_;
                                        fStack_5c54 = (float)((uint)bVar17 * auVar70._12_4_ |
                                                             (uint)!bVar17 * (int)auVar80._12_4_) *
                                                      auVar66._12_4_;
                                        fStack_5c50 = (float)((uint)bVar21 * auVar70._16_4_ |
                                                             (uint)!bVar21 * (int)auVar80._16_4_) *
                                                      0.0;
                                        fStack_5c4c = (float)((uint)bVar19 * auVar70._20_4_ |
                                                             (uint)!bVar19 * (int)auVar80._20_4_) *
                                                      0.0;
                                        fStack_5c48 = (float)((uint)bVar22 * auVar70._24_4_ |
                                                             (uint)!bVar22 * (int)auVar80._24_4_) *
                                                      0.0;
                                        uStack_5c44 = auVar75._28_4_;
                                        local_5c20 = vpbroadcastd_avx512vl();
                                        pRVar13 = context->user;
                                        local_5cc0[0] = (RTCHitN)auVar82[0];
                                        local_5cc0[1] = (RTCHitN)auVar82[1];
                                        local_5cc0[2] = (RTCHitN)auVar82[2];
                                        local_5cc0[3] = (RTCHitN)auVar82[3];
                                        local_5cc0[4] = (RTCHitN)auVar82[4];
                                        local_5cc0[5] = (RTCHitN)auVar82[5];
                                        local_5cc0[6] = (RTCHitN)auVar82[6];
                                        local_5cc0[7] = (RTCHitN)auVar82[7];
                                        local_5cc0[8] = (RTCHitN)auVar82[8];
                                        local_5cc0[9] = (RTCHitN)auVar82[9];
                                        local_5cc0[10] = (RTCHitN)auVar82[10];
                                        local_5cc0[0xb] = (RTCHitN)auVar82[0xb];
                                        local_5cc0[0xc] = (RTCHitN)auVar82[0xc];
                                        local_5cc0[0xd] = (RTCHitN)auVar82[0xd];
                                        local_5cc0[0xe] = (RTCHitN)auVar82[0xe];
                                        local_5cc0[0xf] = (RTCHitN)auVar82[0xf];
                                        local_5cc0[0x10] = (RTCHitN)auVar82[0x10];
                                        local_5cc0[0x11] = (RTCHitN)auVar82[0x11];
                                        local_5cc0[0x12] = (RTCHitN)auVar82[0x12];
                                        local_5cc0[0x13] = (RTCHitN)auVar82[0x13];
                                        local_5cc0[0x14] = (RTCHitN)auVar82[0x14];
                                        local_5cc0[0x15] = (RTCHitN)auVar82[0x15];
                                        local_5cc0[0x16] = (RTCHitN)auVar82[0x16];
                                        local_5cc0[0x17] = (RTCHitN)auVar82[0x17];
                                        local_5cc0[0x18] = (RTCHitN)auVar82[0x18];
                                        local_5cc0[0x19] = (RTCHitN)auVar82[0x19];
                                        local_5cc0[0x1a] = (RTCHitN)auVar82[0x1a];
                                        local_5cc0[0x1b] = (RTCHitN)auVar82[0x1b];
                                        local_5cc0[0x1c] = (RTCHitN)auVar82[0x1c];
                                        local_5cc0[0x1d] = (RTCHitN)auVar82[0x1d];
                                        local_5cc0[0x1e] = (RTCHitN)auVar82[0x1e];
                                        local_5cc0[0x1f] = (RTCHitN)auVar82[0x1f];
                                        local_5ca0 = auVar83;
                                        local_5c80 = auVar84;
                                        local_5c40._4_4_ =
                                             (float)((uint)bVar14 * auVar72._4_4_ |
                                                    (uint)!bVar14 * (int)fVar126) * auVar66._4_4_;
                                        local_5c40._0_4_ =
                                             (float)((uint)(bVar50 & 1) * auVar72._0_4_ |
                                                    (uint)!(bool)(bVar50 & 1) * (int)fVar124) *
                                             auVar66._0_4_;
                                        fStack_5c38 = (float)((uint)bVar16 * auVar72._8_4_ |
                                                             (uint)!bVar16 * (int)fVar127) *
                                                      auVar66._8_4_;
                                        fStack_5c34 = (float)((uint)bVar18 * auVar72._12_4_ |
                                                             (uint)!bVar18 * (int)fVar128) *
                                                      auVar66._12_4_;
                                        fStack_5c30 = (float)((uint)bVar24 * auVar72._16_4_ |
                                                             (uint)!bVar24 * (int)fVar129) * 0.0;
                                        fStack_5c2c = (float)((uint)bVar20 * auVar72._20_4_ |
                                                             (uint)!bVar20 * (int)fVar130) * 0.0;
                                        fStack_5c28 = (float)((uint)bVar23 * auVar72._24_4_ |
                                                             (uint)!bVar23 * (int)fVar131) * 0.0;
                                        fStack_5c24 = auVar97._28_4_;
                                        auVar70 = vpcmpeqd_avx2(_local_5c60,_local_5c60);
                                        local_5e28[1] = auVar70;
                                        *local_5e28 = auVar70;
                                        local_5be0 = pRVar13->instID[0];
                                        uStack_5bdc = local_5be0;
                                        uStack_5bd8 = local_5be0;
                                        uStack_5bd4 = local_5be0;
                                        uStack_5bd0 = local_5be0;
                                        uStack_5bcc = local_5be0;
                                        uStack_5bc8 = local_5be0;
                                        uStack_5bc4 = local_5be0;
                                        local_5bc0 = pRVar13->instPrimID[0];
                                        uStack_5bbc = local_5bc0;
                                        uStack_5bb8 = local_5bc0;
                                        uStack_5bb4 = local_5bc0;
                                        uStack_5bb0 = local_5bc0;
                                        uStack_5bac = local_5bc0;
                                        uStack_5ba8 = local_5bc0;
                                        uStack_5ba4 = local_5bc0;
                                        auVar70 = vmulps_avx512vl(ZEXT1632(auVar66),auVar71);
                                        bVar62 = (bool)(bVar47 >> 1 & 1);
                                        bVar14 = (bool)(bVar47 >> 2 & 1);
                                        bVar15 = (bool)(bVar47 >> 3 & 1);
                                        bVar16 = (bool)(bVar47 >> 4 & 1);
                                        bVar17 = (bool)(bVar47 >> 5 & 1);
                                        bVar18 = (bool)(bVar47 >> 6 & 1);
                                        *(uint *)(ray + 0x100) =
                                             (uint)(bVar47 & 1) * auVar70._0_4_ |
                                             (uint)!(bool)(bVar47 & 1) * (int)local_5ce0;
                                        *(uint *)(ray + 0x104) =
                                             (uint)bVar62 * auVar70._4_4_ |
                                             (uint)!bVar62 * (int)fStack_5cdc;
                                        *(uint *)(ray + 0x108) =
                                             (uint)bVar14 * auVar70._8_4_ |
                                             (uint)!bVar14 * (int)fStack_5cd8;
                                        *(uint *)(ray + 0x10c) =
                                             (uint)bVar15 * auVar70._12_4_ |
                                             (uint)!bVar15 * (int)fStack_5cd4;
                                        *(uint *)(ray + 0x110) =
                                             (uint)bVar16 * auVar70._16_4_ |
                                             (uint)!bVar16 * (int)fStack_5cd0;
                                        *(uint *)(ray + 0x114) =
                                             (uint)bVar17 * auVar70._20_4_ |
                                             (uint)!bVar17 * (int)fStack_5ccc;
                                        *(uint *)(ray + 0x118) =
                                             (uint)bVar18 * auVar70._24_4_ |
                                             (uint)!bVar18 * (int)fStack_5cc8;
                                        *(uint *)(ray + 0x11c) =
                                             (uint)(bVar47 >> 7) * auVar70._28_4_ |
                                             (uint)!(bool)(bVar47 >> 7) * iStack_5cc4;
                                        local_5e00 = vpmovm2d_avx512vl((ulong)bVar47);
                                        local_5ea0.geometryUserPtr = local_5eb0->userPtr;
                                        local_5ea0.valid = (int *)local_5e00;
                                        local_5ea0.context = context->user;
                                        local_5ea0.ray = (RTCRayN *)ray;
                                        local_5ea0.hit = local_5cc0;
                                        local_5ea0.N = 8;
                                        auVar144 = ZEXT436(uVar9);
                                        if (local_5eb0->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                        {
                                          auVar144 = (undefined1  [36])0x0;
                                          (*local_5eb0->occlusionFilterN)(&local_5ea0);
                                        }
                                        if (local_5e00 == (undefined1  [32])0x0) {
                                          uVar54 = 0;
                                        }
                                        else {
                                          p_Var12 = context->args->filter;
                                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((local_5eb0->field_8).field_0x2 & 0x40) != 0)))) {
                                            auVar144 = (undefined1  [36])0x0;
                                            (*p_Var12)(&local_5ea0);
                                          }
                                          uVar54 = vptestmd_avx512vl(local_5e00,local_5e00);
                                          auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          bVar62 = (bool)((byte)uVar54 & 1);
                                          bVar14 = (bool)((byte)(uVar54 >> 1) & 1);
                                          bVar15 = (bool)((byte)(uVar54 >> 2) & 1);
                                          bVar16 = (bool)((byte)(uVar54 >> 3) & 1);
                                          bVar17 = (bool)((byte)(uVar54 >> 4) & 1);
                                          bVar18 = (bool)((byte)(uVar54 >> 5) & 1);
                                          bVar21 = (bool)((byte)(uVar54 >> 6) & 1);
                                          bVar24 = SUB81(uVar54 >> 7,0);
                                          *(uint *)(local_5ea0.ray + 0x100) =
                                               (uint)bVar62 * auVar70._0_4_ |
                                               (uint)!bVar62 * *(int *)(local_5ea0.ray + 0x100);
                                          *(uint *)(local_5ea0.ray + 0x104) =
                                               (uint)bVar14 * auVar70._4_4_ |
                                               (uint)!bVar14 * *(int *)(local_5ea0.ray + 0x104);
                                          *(uint *)(local_5ea0.ray + 0x108) =
                                               (uint)bVar15 * auVar70._8_4_ |
                                               (uint)!bVar15 * *(int *)(local_5ea0.ray + 0x108);
                                          *(uint *)(local_5ea0.ray + 0x10c) =
                                               (uint)bVar16 * auVar70._12_4_ |
                                               (uint)!bVar16 * *(int *)(local_5ea0.ray + 0x10c);
                                          *(uint *)(local_5ea0.ray + 0x110) =
                                               (uint)bVar17 * auVar70._16_4_ |
                                               (uint)!bVar17 * *(int *)(local_5ea0.ray + 0x110);
                                          *(uint *)(local_5ea0.ray + 0x114) =
                                               (uint)bVar18 * auVar70._20_4_ |
                                               (uint)!bVar18 * *(int *)(local_5ea0.ray + 0x114);
                                          *(uint *)(local_5ea0.ray + 0x118) =
                                               (uint)bVar21 * auVar70._24_4_ |
                                               (uint)!bVar21 * *(int *)(local_5ea0.ray + 0x118);
                                          *(uint *)(local_5ea0.ray + 0x11c) =
                                               (uint)bVar24 * auVar70._28_4_ |
                                               (uint)!bVar24 * *(int *)(local_5ea0.ray + 0x11c);
                                        }
                                        bVar47 = (byte)uVar54;
                                        bVar62 = (bool)((byte)(uVar54 >> 1) & 1);
                                        bVar14 = (bool)((byte)(uVar54 >> 2) & 1);
                                        bVar15 = (bool)((byte)(uVar54 >> 3) & 1);
                                        bVar16 = (bool)((byte)(uVar54 >> 4) & 1);
                                        bVar17 = (bool)((byte)(uVar54 >> 5) & 1);
                                        bVar18 = (bool)((byte)(uVar54 >> 6) & 1);
                                        bVar21 = (bool)((byte)(uVar54 >> 7) & 1);
                                        *(uint *)(ray + 0x100) =
                                             (uint)(bVar47 & 1) * *(int *)(ray + 0x100) |
                                             (uint)!(bool)(bVar47 & 1) * (int)local_5ce0;
                                        *(uint *)(ray + 0x104) =
                                             (uint)bVar62 * *(int *)(ray + 0x104) |
                                             (uint)!bVar62 * (int)fStack_5cdc;
                                        *(uint *)(ray + 0x108) =
                                             (uint)bVar14 * *(int *)(ray + 0x108) |
                                             (uint)!bVar14 * (int)fStack_5cd8;
                                        *(uint *)(ray + 0x10c) =
                                             (uint)bVar15 * *(int *)(ray + 0x10c) |
                                             (uint)!bVar15 * (int)fStack_5cd4;
                                        *(uint *)(ray + 0x110) =
                                             (uint)bVar16 * *(int *)(ray + 0x110) |
                                             (uint)!bVar16 * (int)fStack_5cd0;
                                        *(uint *)(ray + 0x114) =
                                             (uint)bVar17 * *(int *)(ray + 0x114) |
                                             (uint)!bVar17 * (int)fStack_5ccc;
                                        *(uint *)(ray + 0x118) =
                                             (uint)bVar18 * *(int *)(ray + 0x118) |
                                             (uint)!bVar18 * (int)fStack_5cc8;
                                        *(uint *)(ray + 0x11c) =
                                             (uint)bVar21 * *(int *)(ray + 0x11c) |
                                             (uint)!bVar21 * iStack_5cc4;
                                        auVar105 = ZEXT3264(*(undefined1 (*) [32])ray);
                                        auVar107 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x20));
                                        auVar112 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x40));
                                        auVar70 = *(undefined1 (*) [32])(ray + 0x80);
                                        auVar72 = *(undefined1 (*) [32])(ray + 0xa0);
                                        auVar75 = *(undefined1 (*) [32])(ray + 0xc0);
                                      }
                                      bVar55 = bVar55 & ~bVar47;
                                      auVar76 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                      auVar71 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar65 = vxorps_avx512vl(auVar65,auVar65);
                                      auVar66 = vmovdqa64_avx512vl(local_5ef0);
                                      auVar69 = vmovdqa64_avx512vl(local_5f00);
                                      auVar143 = auVar144;
                                    }
                                    auVar151 = ZEXT1664(auVar69);
                                    auVar98 = ZEXT1664(auVar66);
                                    auVar150 = ZEXT1664(auVar65);
                                    auVar149 = ZEXT3264(auVar71);
                                    auVar148 = ZEXT3264(auVar73);
                                    auVar147 = ZEXT3264(auVar74);
                                    auVar146 = ZEXT3264(auVar76);
                                    auVar76 = local_5d40;
                                    auVar77 = local_5d60;
                                    auVar78 = local_5d80;
                                  }
                                }
                              }
                              auVar145 = auVar150._0_16_;
                              auVar38._4_4_ = fStack_5edc;
                              auVar38._0_4_ = local_5ee0;
                              auVar38._8_4_ = fStack_5ed8;
                              auVar38._12_4_ = fStack_5ed4;
                              auVar38._16_4_ = fStack_5ed0;
                              auVar38._20_4_ = fStack_5ecc;
                              auVar38._24_4_ = fStack_5ec8;
                              auVar38._28_4_ = fStack_5ec4;
                              auVar39._4_4_ = fStack_5ddc;
                              auVar39._0_4_ = local_5de0;
                              auVar39._8_4_ = fStack_5dd8;
                              auVar39._12_4_ = fStack_5dd4;
                              auVar39._16_4_ = fStack_5dd0;
                              auVar39._20_4_ = fStack_5dcc;
                              auVar39._24_4_ = fStack_5dc8;
                              auVar39._28_4_ = fStack_5dc4;
                              auVar71 = vsubps_avx512vl(auVar76,auVar38);
                              auVar73 = vsubps_avx512vl(auVar77,_local_5e60);
                              auVar74 = vsubps_avx512vl(auVar78,auVar39);
                              auVar45._4_4_ = fStack_583c;
                              auVar45._0_4_ = local_5840;
                              auVar45._8_4_ = fStack_5838;
                              auVar45._12_4_ = fStack_5834;
                              auVar45._16_4_ = fStack_5830;
                              auVar45._20_4_ = fStack_582c;
                              auVar45._24_4_ = fStack_5828;
                              auVar45._28_4_ = fStack_5824;
                              auVar79 = vsubps_avx512vl(auVar45,auVar76);
                              auVar44._4_4_ = fStack_585c;
                              auVar44._0_4_ = local_5860;
                              auVar44._8_4_ = fStack_5858;
                              auVar44._12_4_ = fStack_5854;
                              auVar44._16_4_ = fStack_5850;
                              auVar44._20_4_ = fStack_584c;
                              auVar44._24_4_ = fStack_5848;
                              auVar44._28_4_ = fStack_5844;
                              auVar80 = vsubps_avx512vl(auVar44,auVar77);
                              auVar43._4_4_ = fStack_587c;
                              auVar43._0_4_ = local_5880;
                              auVar43._8_4_ = fStack_5878;
                              auVar43._12_4_ = fStack_5874;
                              auVar43._16_4_ = fStack_5870;
                              auVar43._20_4_ = fStack_586c;
                              auVar43._24_4_ = fStack_5868;
                              auVar43._28_4_ = fStack_5864;
                              auVar81 = vsubps_avx512vl(auVar43,auVar78);
                              auVar82 = vmulps_avx512vl(auVar73,auVar81);
                              auVar82 = vfmsub231ps_avx512vl(auVar82,auVar80,auVar74);
                              auVar83 = vmulps_avx512vl(auVar74,auVar79);
                              auVar83 = vfmsub231ps_avx512vl(auVar83,auVar81,auVar71);
                              auVar84 = vmulps_avx512vl(auVar71,auVar80);
                              auVar84 = vfmsub231ps_avx512vl(auVar84,auVar79,auVar73);
                              auVar76 = vsubps_avx512vl(auVar76,auVar105._0_32_);
                              auVar77 = vsubps_avx512vl(auVar77,auVar107._0_32_);
                              auVar78 = vsubps_avx512vl(auVar78,auVar112._0_32_);
                              fVar132 = auVar78._0_4_;
                              auVar106._0_4_ = fVar132 * auVar72._0_4_;
                              fVar99 = auVar78._4_4_;
                              auVar106._4_4_ = fVar99 * auVar72._4_4_;
                              fVar134 = auVar78._8_4_;
                              auVar106._8_4_ = fVar134 * auVar72._8_4_;
                              fVar135 = auVar78._12_4_;
                              auVar106._12_4_ = fVar135 * auVar72._12_4_;
                              fVar136 = auVar78._16_4_;
                              auVar106._16_4_ = fVar136 * auVar72._16_4_;
                              fVar137 = auVar78._20_4_;
                              auVar106._20_4_ = fVar137 * auVar72._20_4_;
                              auVar106._28_36_ = auVar105._28_36_;
                              fVar138 = auVar78._24_4_;
                              auVar106._24_4_ = fVar138 * auVar72._24_4_;
                              auVar66 = vfmsub231ps_fma(auVar106._0_32_,auVar77,auVar75);
                              auVar105._0_4_ = auVar76._0_4_ * auVar75._0_4_;
                              auVar105._4_4_ = auVar76._4_4_ * auVar75._4_4_;
                              auVar105._8_4_ = auVar76._8_4_ * auVar75._8_4_;
                              auVar105._12_4_ = auVar76._12_4_ * auVar75._12_4_;
                              auVar105._16_4_ = auVar76._16_4_ * auVar75._16_4_;
                              auVar105._20_4_ = auVar76._20_4_ * auVar75._20_4_;
                              auVar105._28_36_ = auVar107._28_36_;
                              auVar105._24_4_ = auVar76._24_4_ * auVar75._24_4_;
                              auVar69 = vfmsub231ps_fma(auVar105._0_32_,auVar78,auVar70);
                              auVar142._0_4_ = auVar77._0_4_ * auVar70._0_4_;
                              auVar142._4_4_ = auVar77._4_4_ * auVar70._4_4_;
                              auVar142._8_4_ = auVar77._8_4_ * auVar70._8_4_;
                              auVar142._12_4_ = auVar77._12_4_ * auVar70._12_4_;
                              auVar142._16_4_ = auVar77._16_4_ * auVar70._16_4_;
                              auVar142._20_4_ = auVar77._20_4_ * auVar70._20_4_;
                              auVar142._24_4_ = auVar77._24_4_ * auVar70._24_4_;
                              auVar142._28_36_ = auVar143;
                              auVar68 = vfmsub231ps_fma(auVar142._0_32_,auVar76,auVar72);
                              auVar107._0_4_ = auVar84._0_4_ * auVar75._0_4_;
                              auVar107._4_4_ = auVar84._4_4_ * auVar75._4_4_;
                              auVar107._8_4_ = auVar84._8_4_ * auVar75._8_4_;
                              auVar107._12_4_ = auVar84._12_4_ * auVar75._12_4_;
                              auVar107._16_4_ = auVar84._16_4_ * auVar75._16_4_;
                              auVar107._20_4_ = auVar84._20_4_ * auVar75._20_4_;
                              auVar107._28_36_ = auVar112._28_36_;
                              auVar107._24_4_ = auVar84._24_4_ * auVar75._24_4_;
                              auVar65 = vfmadd231ps_fma(auVar107._0_32_,auVar83,auVar72);
                              auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar82,auVar70);
                              vandps_avx512vl(ZEXT1632(auVar65),auVar149._0_32_);
                              auVar70 = vmulps_avx512vl(auVar81,ZEXT1632(auVar68));
                              auVar70 = vfmadd231ps_avx512vl(auVar70,ZEXT1632(auVar69),auVar80);
                              auVar70 = vfmadd231ps_avx512vl(auVar70,ZEXT1632(auVar66),auVar79);
                              fVar124 = auVar70._0_4_;
                              auVar115._0_4_ = (uint)fVar132 ^ (uint)fVar124;
                              fVar126 = auVar70._4_4_;
                              auVar115._4_4_ = (uint)fVar99 ^ (uint)fVar126;
                              fVar127 = auVar70._8_4_;
                              auVar115._8_4_ = (uint)fVar134 ^ (uint)fVar127;
                              fVar128 = auVar70._12_4_;
                              auVar115._12_4_ = (uint)fVar135 ^ (uint)fVar128;
                              fVar129 = auVar70._16_4_;
                              auVar115._16_4_ = (uint)fVar136 ^ (uint)fVar129;
                              fVar130 = auVar70._20_4_;
                              auVar115._20_4_ = (uint)fVar137 ^ (uint)fVar130;
                              fVar131 = auVar70._24_4_;
                              auVar115._24_4_ = (uint)fVar138 ^ (uint)fVar131;
                              auVar96._28_4_ = auVar78._28_4_;
                              auVar115._28_4_ = auVar96._28_4_ ^ auVar70._28_4_;
                              uVar25 = vcmpps_avx512vl(auVar115,auVar150._0_32_,5);
                              bVar50 = (byte)uVar25 & bVar55;
                              if (bVar50 != 0) {
                                auVar33._4_4_ = auVar74._4_4_ * auVar68._4_4_;
                                auVar33._0_4_ = auVar74._0_4_ * auVar68._0_4_;
                                auVar33._8_4_ = auVar74._8_4_ * auVar68._8_4_;
                                auVar33._12_4_ = auVar74._12_4_ * auVar68._12_4_;
                                auVar33._16_4_ = auVar74._16_4_ * 0.0;
                                auVar33._20_4_ = auVar74._20_4_ * 0.0;
                                auVar33._24_4_ = auVar74._24_4_ * 0.0;
                                auVar33._28_4_ = auVar70._28_4_;
                                auVar69 = vfmadd213ps_fma(ZEXT1632(auVar69),auVar73,auVar33);
                                auVar66 = vfmadd213ps_fma(ZEXT1632(auVar66),auVar71,
                                                          ZEXT1632(auVar69));
                                auVar103._0_4_ = (uint)fVar132 ^ auVar66._0_4_;
                                auVar103._4_4_ = (uint)fVar99 ^ auVar66._4_4_;
                                auVar103._8_4_ = (uint)fVar134 ^ auVar66._8_4_;
                                auVar103._12_4_ = (uint)fVar135 ^ auVar66._12_4_;
                                auVar103._16_4_ = fVar136;
                                auVar103._20_4_ = fVar137;
                                auVar103._24_4_ = fVar138;
                                auVar103._28_4_ = auVar96._28_4_;
                                uVar25 = vcmpps_avx512vl(auVar103,auVar150._0_32_,5);
                                bVar50 = bVar50 & (byte)uVar25;
                                if (bVar50 != 0) {
                                  vandps_avx512vl(ZEXT1632(auVar65),auVar146._0_32_);
                                  auVar72 = vsubps_avx(auVar70,auVar115);
                                  uVar25 = vcmpps_avx512vl(auVar72,auVar103,5);
                                  bVar50 = bVar50 & (byte)uVar25;
                                  if (bVar50 != 0) {
                                    local_5f00 = vmovdqa64_avx512vl(auVar151._0_16_);
                                    local_5ef0 = vmovdqa64_avx512vl(auVar98._0_16_);
                                    auVar34._4_4_ = auVar84._4_4_ * fVar99;
                                    auVar34._0_4_ = auVar84._0_4_ * fVar132;
                                    auVar34._8_4_ = auVar84._8_4_ * fVar134;
                                    auVar34._12_4_ = auVar84._12_4_ * fVar135;
                                    auVar34._16_4_ = auVar84._16_4_ * fVar136;
                                    auVar34._20_4_ = auVar84._20_4_ * fVar137;
                                    auVar34._24_4_ = auVar84._24_4_ * fVar138;
                                    auVar34._28_4_ = auVar115._28_4_;
                                    auVar66 = vfmadd213ps_fma(auVar77,auVar83,auVar34);
                                    auVar66 = vfmadd213ps_fma(auVar76,auVar82,ZEXT1632(auVar66));
                                    auVar96._0_4_ = auVar66._0_4_ ^ (uint)fVar132;
                                    auVar96._4_4_ = auVar66._4_4_ ^ (uint)fVar99;
                                    auVar96._8_4_ = auVar66._8_4_ ^ (uint)fVar134;
                                    auVar96._12_4_ = auVar66._12_4_ ^ (uint)fVar135;
                                    auVar96._16_4_ = fVar136;
                                    auVar96._20_4_ = fVar137;
                                    auVar96._24_4_ = fVar138;
                                    auVar35._4_4_ = fVar126 * *(float *)(ray + 100);
                                    auVar35._0_4_ = fVar124 * *(float *)(ray + 0x60);
                                    auVar35._8_4_ = fVar127 * *(float *)(ray + 0x68);
                                    auVar35._12_4_ = fVar128 * *(float *)(ray + 0x6c);
                                    auVar35._16_4_ = fVar129 * *(float *)(ray + 0x70);
                                    auVar35._20_4_ = fVar130 * *(float *)(ray + 0x74);
                                    auVar35._24_4_ = fVar131 * *(float *)(ray + 0x78);
                                    auVar35._28_4_ = auVar115._28_4_;
                                    pRVar1 = ray + 0x100;
                                    auVar46 = *(undefined1 (*) [28])pRVar1;
                                    iVar48 = *(int *)(ray + 0x11c);
                                    _local_5e60 = *(undefined1 (*) [32])pRVar1;
                                    auVar75 = _local_5e60;
                                    auVar36._4_4_ = *(float *)(ray + 0x104) * fVar126;
                                    auVar36._0_4_ = *(float *)pRVar1 * fVar124;
                                    auVar36._8_4_ = *(float *)(ray + 0x108) * fVar127;
                                    auVar36._12_4_ = *(float *)(ray + 0x10c) * fVar128;
                                    auVar36._16_4_ = *(float *)(ray + 0x110) * fVar129;
                                    auVar36._20_4_ = *(float *)(ray + 0x114) * fVar130;
                                    auVar36._24_4_ = *(float *)(ray + 0x118) * fVar131;
                                    auVar36._28_4_ = iVar48;
                                    uVar25 = vcmpps_avx512vl(auVar96,auVar36,2);
                                    uVar26 = vcmpps_avx512vl(auVar35,auVar96,1);
                                    bVar50 = bVar50 & (byte)uVar25 & (byte)uVar26;
                                    if (bVar50 != 0) {
                                      uVar25 = vcmpps_avx512vl(ZEXT1632(auVar65),ZEXT832(0) << 0x20,
                                                               4);
                                      bVar50 = bVar50 & (byte)uVar25;
                                      if (bVar50 != 0) {
                                        pGVar10 = (context->scene->geometries).items
                                                  [*(uint *)(local_5d00 + uVar63 * 4)].ptr;
                                        local_5ee0 = SUB84(pGVar10,0);
                                        fStack_5edc = (float)((ulong)pGVar10 >> 0x20);
                                        uVar9 = pGVar10->mask;
                                        auVar109._4_4_ = uVar9;
                                        auVar109._0_4_ = uVar9;
                                        auVar109._8_4_ = uVar9;
                                        auVar109._12_4_ = uVar9;
                                        auVar109._16_4_ = uVar9;
                                        auVar109._20_4_ = uVar9;
                                        auVar109._24_4_ = uVar9;
                                        auVar109._28_4_ = uVar9;
                                        uVar25 = vptestmd_avx512vl(auVar109,*(undefined1 (*) [32])
                                                                             (ray + 0x120));
                                        bVar47 = (byte)uVar25 & bVar50;
                                        if (bVar47 != 0) {
                                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                             (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0))
                                          {
                                            auVar65 = vcvtsi2ss_avx512f(auVar64,*(ushort *)
                                                                                 (local_5e10 + 8 +
                                                                                 local_5e18) - 1);
                                            auVar66 = vcvtsi2ss_avx512f(auVar64,*(ushort *)
                                                                                 (local_5e10 + 10 +
                                                                                 local_5e18) - 1);
                                            auVar69 = vcvtsi2ss_avx512f(auVar64,((uint)uVar63 & 1) +
                                                                                local_5f04);
                                            auVar64 = vcvtsi2ss_avx512f(auVar64,((uint)(uVar63 >> 1)
                                                                                & 0x7fffffff) +
                                                                                local_5f08);
                                            local_5c00 = vpbroadcastd_avx512vl();
                                            auVar37._12_4_ = 0;
                                            auVar37._0_12_ = ZEXT812(0);
                                            auVar68 = vrcp14ss_avx512f(auVar37 << 0x20,
                                                                       ZEXT416(auVar65._0_4_));
                                            auVar65 = vfnmadd213ss_fma(auVar65,auVar68,
                                                                       SUB6416(ZEXT464(0x40000000),0
                                                                              ));
                                            fVar132 = auVar68._0_4_ * auVar65._0_4_;
                                            fVar99 = auVar69._0_4_;
                                            auVar123._0_4_ = fVar99 * fVar124 + auVar72._0_4_;
                                            auVar123._4_4_ = fVar99 * fVar126 + auVar72._4_4_;
                                            auVar123._8_4_ = fVar99 * fVar127 + auVar72._8_4_;
                                            auVar123._12_4_ = fVar99 * fVar128 + auVar72._12_4_;
                                            auVar123._16_4_ = fVar99 * fVar129 + auVar72._16_4_;
                                            auVar123._20_4_ = fVar99 * fVar130 + auVar72._20_4_;
                                            auVar123._24_4_ = fVar99 * fVar131 + auVar72._24_4_;
                                            auVar123._28_4_ = fVar99 + auVar72._28_4_;
                                            auVar110._4_4_ = fVar132;
                                            auVar110._0_4_ = fVar132;
                                            auVar110._8_4_ = fVar132;
                                            auVar110._12_4_ = fVar132;
                                            auVar110._16_4_ = fVar132;
                                            auVar110._20_4_ = fVar132;
                                            auVar110._24_4_ = fVar132;
                                            auVar110._28_4_ = fVar132;
                                            auVar73 = vmulps_avx512vl(auVar123,auVar110);
                                            bVar62 = (bool)(bVar50 >> 1 & 1);
                                            bVar15 = (bool)(bVar50 >> 2 & 1);
                                            bVar17 = (bool)(bVar50 >> 3 & 1);
                                            bVar21 = (bool)(bVar50 >> 4 & 1);
                                            bVar19 = (bool)(bVar50 >> 5 & 1);
                                            bVar22 = (bool)(bVar50 >> 6 & 1);
                                            auVar69 = vrcp14ss_avx512f(auVar37 << 0x20,
                                                                       ZEXT416(auVar66._0_4_));
                                            auVar65 = vfnmadd213ss_fma(auVar66,auVar69,
                                                                       SUB6416(ZEXT464(0x40000000),0
                                                                              ));
                                            fVar132 = auVar69._0_4_ * auVar65._0_4_;
                                            auVar71 = vsubps_avx(auVar70,auVar103);
                                            fVar99 = auVar64._0_4_;
                                            auVar116._0_4_ = fVar99 * fVar124 + auVar71._0_4_;
                                            auVar116._4_4_ = fVar99 * fVar126 + auVar71._4_4_;
                                            auVar116._8_4_ = fVar99 * fVar127 + auVar71._8_4_;
                                            auVar116._12_4_ = fVar99 * fVar128 + auVar71._12_4_;
                                            auVar116._16_4_ = fVar99 * fVar129 + auVar71._16_4_;
                                            auVar116._20_4_ = fVar99 * fVar130 + auVar71._20_4_;
                                            auVar116._24_4_ = fVar99 * fVar131 + auVar71._24_4_;
                                            auVar116._28_4_ = fVar99 + auVar71._28_4_;
                                            auVar111._4_4_ = fVar132;
                                            auVar111._0_4_ = fVar132;
                                            auVar111._8_4_ = fVar132;
                                            auVar111._12_4_ = fVar132;
                                            auVar111._16_4_ = fVar132;
                                            auVar111._20_4_ = fVar132;
                                            auVar111._24_4_ = fVar132;
                                            auVar111._28_4_ = fVar132;
                                            auVar74 = vmulps_avx512vl(auVar116,auVar111);
                                            bVar14 = (bool)(bVar50 >> 1 & 1);
                                            bVar16 = (bool)(bVar50 >> 2 & 1);
                                            bVar18 = (bool)(bVar50 >> 3 & 1);
                                            bVar24 = (bool)(bVar50 >> 4 & 1);
                                            bVar20 = (bool)(bVar50 >> 5 & 1);
                                            bVar23 = (bool)(bVar50 >> 6 & 1);
                                            auVar76 = vrcp14ps_avx512vl(auVar70);
                                            auVar29._8_4_ = 0x3f800000;
                                            auVar29._0_8_ = 0x3f8000003f800000;
                                            auVar29._12_4_ = 0x3f800000;
                                            auVar29._16_4_ = 0x3f800000;
                                            auVar29._20_4_ = 0x3f800000;
                                            auVar29._24_4_ = 0x3f800000;
                                            auVar29._28_4_ = 0x3f800000;
                                            auVar70 = vfnmadd213ps_avx512vl(auVar70,auVar76,auVar29)
                                            ;
                                            auVar64 = vfmadd132ps_fma(auVar70,auVar76,auVar76);
                                            local_5c40._4_4_ =
                                                 (float)((uint)bVar14 * auVar74._4_4_ |
                                                        (uint)!bVar14 * (int)auVar71._4_4_) *
                                                 auVar64._4_4_;
                                            local_5c40._0_4_ =
                                                 (float)((uint)(bVar50 & 1) * auVar74._0_4_ |
                                                        (uint)!(bool)(bVar50 & 1) *
                                                        (int)auVar71._0_4_) * auVar64._0_4_;
                                            fStack_5c38 = (float)((uint)bVar16 * auVar74._8_4_ |
                                                                 (uint)!bVar16 * (int)auVar71._8_4_)
                                                          * auVar64._8_4_;
                                            fStack_5c34 = (float)((uint)bVar18 * auVar74._12_4_ |
                                                                 (uint)!bVar18 * (int)auVar71._12_4_
                                                                 ) * auVar64._12_4_;
                                            fStack_5c30 = (float)((uint)bVar24 * auVar74._16_4_ |
                                                                 (uint)!bVar24 * (int)auVar71._16_4_
                                                                 ) * 0.0;
                                            fStack_5c2c = (float)((uint)bVar20 * auVar74._20_4_ |
                                                                 (uint)!bVar20 * (int)auVar71._20_4_
                                                                 ) * 0.0;
                                            fStack_5c28 = (float)((uint)bVar23 * auVar74._24_4_ |
                                                                 (uint)!bVar23 * (int)auVar71._24_4_
                                                                 ) * 0.0;
                                            fStack_5c24 = (float)((uint)(bVar50 >> 7) *
                                                                  auVar74._28_4_ |
                                                                 (uint)!(bool)(bVar50 >> 7) *
                                                                 (int)auVar71._28_4_);
                                            local_5c20 = vpbroadcastd_avx512vl();
                                            pRVar13 = context->user;
                                            local_5cc0[0] = (RTCHitN)auVar82[0];
                                            local_5cc0[1] = (RTCHitN)auVar82[1];
                                            local_5cc0[2] = (RTCHitN)auVar82[2];
                                            local_5cc0[3] = (RTCHitN)auVar82[3];
                                            local_5cc0[4] = (RTCHitN)auVar82[4];
                                            local_5cc0[5] = (RTCHitN)auVar82[5];
                                            local_5cc0[6] = (RTCHitN)auVar82[6];
                                            local_5cc0[7] = (RTCHitN)auVar82[7];
                                            local_5cc0[8] = (RTCHitN)auVar82[8];
                                            local_5cc0[9] = (RTCHitN)auVar82[9];
                                            local_5cc0[10] = (RTCHitN)auVar82[10];
                                            local_5cc0[0xb] = (RTCHitN)auVar82[0xb];
                                            local_5cc0[0xc] = (RTCHitN)auVar82[0xc];
                                            local_5cc0[0xd] = (RTCHitN)auVar82[0xd];
                                            local_5cc0[0xe] = (RTCHitN)auVar82[0xe];
                                            local_5cc0[0xf] = (RTCHitN)auVar82[0xf];
                                            local_5cc0[0x10] = (RTCHitN)auVar82[0x10];
                                            local_5cc0[0x11] = (RTCHitN)auVar82[0x11];
                                            local_5cc0[0x12] = (RTCHitN)auVar82[0x12];
                                            local_5cc0[0x13] = (RTCHitN)auVar82[0x13];
                                            local_5cc0[0x14] = (RTCHitN)auVar82[0x14];
                                            local_5cc0[0x15] = (RTCHitN)auVar82[0x15];
                                            local_5cc0[0x16] = (RTCHitN)auVar82[0x16];
                                            local_5cc0[0x17] = (RTCHitN)auVar82[0x17];
                                            local_5cc0[0x18] = (RTCHitN)auVar82[0x18];
                                            local_5cc0[0x19] = (RTCHitN)auVar82[0x19];
                                            local_5cc0[0x1a] = (RTCHitN)auVar82[0x1a];
                                            local_5cc0[0x1b] = (RTCHitN)auVar82[0x1b];
                                            local_5cc0[0x1c] = (RTCHitN)auVar82[0x1c];
                                            local_5cc0[0x1d] = (RTCHitN)auVar82[0x1d];
                                            local_5cc0[0x1e] = (RTCHitN)auVar82[0x1e];
                                            local_5cc0[0x1f] = (RTCHitN)auVar82[0x1f];
                                            local_5ca0 = auVar83;
                                            local_5c80 = auVar84;
                                            local_5c60._4_4_ =
                                                 (float)((uint)bVar62 * auVar73._4_4_ |
                                                        (uint)!bVar62 * (int)auVar72._4_4_) *
                                                 auVar64._4_4_;
                                            local_5c60._0_4_ =
                                                 (float)((uint)(bVar50 & 1) * auVar73._0_4_ |
                                                        (uint)!(bool)(bVar50 & 1) *
                                                        (int)auVar72._0_4_) * auVar64._0_4_;
                                            fStack_5c58 = (float)((uint)bVar15 * auVar73._8_4_ |
                                                                 (uint)!bVar15 * (int)auVar72._8_4_)
                                                          * auVar64._8_4_;
                                            fStack_5c54 = (float)((uint)bVar17 * auVar73._12_4_ |
                                                                 (uint)!bVar17 * (int)auVar72._12_4_
                                                                 ) * auVar64._12_4_;
                                            fStack_5c50 = (float)((uint)bVar21 * auVar73._16_4_ |
                                                                 (uint)!bVar21 * (int)auVar72._16_4_
                                                                 ) * 0.0;
                                            fStack_5c4c = (float)((uint)bVar19 * auVar73._20_4_ |
                                                                 (uint)!bVar19 * (int)auVar72._20_4_
                                                                 ) * 0.0;
                                            fStack_5c48 = (float)((uint)bVar22 * auVar73._24_4_ |
                                                                 (uint)!bVar22 * (int)auVar72._24_4_
                                                                 ) * 0.0;
                                            uStack_5c44 = (uint)(bVar50 >> 7) * auVar73._28_4_ |
                                                          (uint)!(bool)(bVar50 >> 7) *
                                                          (int)auVar72._28_4_;
                                            auVar70 = vpcmpeqd_avx2(_local_5c40,_local_5c40);
                                            local_5e28[1] = auVar70;
                                            *local_5e28 = auVar70;
                                            local_5be0 = pRVar13->instID[0];
                                            uStack_5bdc = local_5be0;
                                            uStack_5bd8 = local_5be0;
                                            uStack_5bd4 = local_5be0;
                                            uStack_5bd0 = local_5be0;
                                            uStack_5bcc = local_5be0;
                                            uStack_5bc8 = local_5be0;
                                            uStack_5bc4 = local_5be0;
                                            local_5bc0 = pRVar13->instPrimID[0];
                                            uStack_5bbc = local_5bc0;
                                            uStack_5bb8 = local_5bc0;
                                            uStack_5bb4 = local_5bc0;
                                            uStack_5bb0 = local_5bc0;
                                            uStack_5bac = local_5bc0;
                                            uStack_5ba8 = local_5bc0;
                                            uStack_5ba4 = local_5bc0;
                                            local_5e60._0_4_ = auVar46._0_4_;
                                            local_5e60._4_4_ = auVar46._4_4_;
                                            fStack_5e58 = auVar46._8_4_;
                                            fStack_5e54 = auVar46._12_4_;
                                            fStack_5e50 = auVar46._16_4_;
                                            fStack_5e4c = auVar46._20_4_;
                                            fStack_5e48 = auVar46._24_4_;
                                            auVar70 = vmulps_avx512vl(ZEXT1632(auVar64),auVar96);
                                            auVar88._0_4_ =
                                                 (uint)(bVar47 & 1) * auVar70._0_4_ |
                                                 (uint)!(bool)(bVar47 & 1) * local_5e60._0_4_;
                                            bVar62 = (bool)(bVar47 >> 1 & 1);
                                            auVar88._4_4_ =
                                                 (uint)bVar62 * auVar70._4_4_ |
                                                 (uint)!bVar62 * local_5e60._4_4_;
                                            bVar62 = (bool)(bVar47 >> 2 & 1);
                                            auVar88._8_4_ =
                                                 (uint)bVar62 * auVar70._8_4_ |
                                                 (uint)!bVar62 * (int)fStack_5e58;
                                            bVar62 = (bool)(bVar47 >> 3 & 1);
                                            auVar88._12_4_ =
                                                 (uint)bVar62 * auVar70._12_4_ |
                                                 (uint)!bVar62 * (int)fStack_5e54;
                                            bVar62 = (bool)(bVar47 >> 4 & 1);
                                            auVar88._16_4_ =
                                                 (uint)bVar62 * auVar70._16_4_ |
                                                 (uint)!bVar62 * (int)fStack_5e50;
                                            bVar62 = (bool)(bVar47 >> 5 & 1);
                                            auVar88._20_4_ =
                                                 (uint)bVar62 * auVar70._20_4_ |
                                                 (uint)!bVar62 * (int)fStack_5e4c;
                                            bVar62 = (bool)(bVar47 >> 6 & 1);
                                            auVar88._24_4_ =
                                                 (uint)bVar62 * auVar70._24_4_ |
                                                 (uint)!bVar62 * (int)fStack_5e48;
                                            auVar88._28_4_ =
                                                 (uint)(bVar47 >> 7) * auVar70._28_4_ |
                                                 (uint)!(bool)(bVar47 >> 7) * iVar48;
                                            *(undefined1 (*) [32])(ray + 0x100) = auVar88;
                                            local_5e00 = vpmovm2d_avx512vl((ulong)bVar47);
                                            local_5ea0.geometryUserPtr = pGVar10->userPtr;
                                            local_5ea0.valid = (int *)local_5e00;
                                            local_5ea0.context = context->user;
                                            local_5ea0.ray = (RTCRayN *)ray;
                                            local_5ea0.hit = local_5cc0;
                                            local_5ea0.N = 8;
                                            _local_5e60 = auVar75;
                                            if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0
                                               ) {
                                              (*pGVar10->occlusionFilterN)(&local_5ea0);
                                            }
                                            if (local_5e00 == (undefined1  [32])0x0) {
                                              uVar54 = 0;
                                            }
                                            else {
                                              p_Var12 = context->args->filter;
                                              if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                                 (((context->args->flags &
                                                   RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                   RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                  ((*(byte *)(CONCAT44(fStack_5edc,local_5ee0) +
                                                             0x3e) & 0x40) != 0)))) {
                                                (*p_Var12)(&local_5ea0);
                                              }
                                              uVar54 = vptestmd_avx512vl(local_5e00,local_5e00);
                                              auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                              bVar62 = (bool)((byte)uVar54 & 1);
                                              bVar14 = (bool)((byte)(uVar54 >> 1) & 1);
                                              bVar15 = (bool)((byte)(uVar54 >> 2) & 1);
                                              bVar16 = (bool)((byte)(uVar54 >> 3) & 1);
                                              bVar17 = (bool)((byte)(uVar54 >> 4) & 1);
                                              bVar18 = (bool)((byte)(uVar54 >> 5) & 1);
                                              bVar21 = (bool)((byte)(uVar54 >> 6) & 1);
                                              bVar24 = SUB81(uVar54 >> 7,0);
                                              *(uint *)(local_5ea0.ray + 0x100) =
                                                   (uint)bVar62 * auVar70._0_4_ |
                                                   (uint)!bVar62 * *(int *)(local_5ea0.ray + 0x100);
                                              *(uint *)(local_5ea0.ray + 0x104) =
                                                   (uint)bVar14 * auVar70._4_4_ |
                                                   (uint)!bVar14 * *(int *)(local_5ea0.ray + 0x104);
                                              *(uint *)(local_5ea0.ray + 0x108) =
                                                   (uint)bVar15 * auVar70._8_4_ |
                                                   (uint)!bVar15 * *(int *)(local_5ea0.ray + 0x108);
                                              *(uint *)(local_5ea0.ray + 0x10c) =
                                                   (uint)bVar16 * auVar70._12_4_ |
                                                   (uint)!bVar16 * *(int *)(local_5ea0.ray + 0x10c);
                                              *(uint *)(local_5ea0.ray + 0x110) =
                                                   (uint)bVar17 * auVar70._16_4_ |
                                                   (uint)!bVar17 * *(int *)(local_5ea0.ray + 0x110);
                                              *(uint *)(local_5ea0.ray + 0x114) =
                                                   (uint)bVar18 * auVar70._20_4_ |
                                                   (uint)!bVar18 * *(int *)(local_5ea0.ray + 0x114);
                                              *(uint *)(local_5ea0.ray + 0x118) =
                                                   (uint)bVar21 * auVar70._24_4_ |
                                                   (uint)!bVar21 * *(int *)(local_5ea0.ray + 0x118);
                                              *(uint *)(local_5ea0.ray + 0x11c) =
                                                   (uint)bVar24 * auVar70._28_4_ |
                                                   (uint)!bVar24 * *(int *)(local_5ea0.ray + 0x11c);
                                            }
                                            bVar47 = (byte)uVar54;
                                            bVar62 = (bool)((byte)(uVar54 >> 1) & 1);
                                            bVar14 = (bool)((byte)(uVar54 >> 2) & 1);
                                            bVar15 = (bool)((byte)(uVar54 >> 3) & 1);
                                            bVar16 = (bool)((byte)(uVar54 >> 4) & 1);
                                            bVar17 = (bool)((byte)(uVar54 >> 5) & 1);
                                            bVar18 = (bool)((byte)(uVar54 >> 6) & 1);
                                            bVar21 = (bool)((byte)(uVar54 >> 7) & 1);
                                            *(uint *)local_5e20 =
                                                 (uint)(bVar47 & 1) * *(int *)local_5e20 |
                                                 (uint)!(bool)(bVar47 & 1) * local_5e60._0_4_;
                                            *(uint *)(local_5e20 + 4) =
                                                 (uint)bVar62 * *(int *)(local_5e20 + 4) |
                                                 (uint)!bVar62 * local_5e60._4_4_;
                                            *(uint *)(local_5e20 + 8) =
                                                 (uint)bVar14 * *(int *)(local_5e20 + 8) |
                                                 (uint)!bVar14 * (int)fStack_5e58;
                                            *(uint *)(local_5e20 + 0xc) =
                                                 (uint)bVar15 * *(int *)(local_5e20 + 0xc) |
                                                 (uint)!bVar15 * (int)fStack_5e54;
                                            *(uint *)(local_5e20 + 0x10) =
                                                 (uint)bVar16 * *(int *)(local_5e20 + 0x10) |
                                                 (uint)!bVar16 * (int)fStack_5e50;
                                            *(uint *)(local_5e20 + 0x14) =
                                                 (uint)bVar17 * *(int *)(local_5e20 + 0x14) |
                                                 (uint)!bVar17 * (int)fStack_5e4c;
                                            *(uint *)(local_5e20 + 0x18) =
                                                 (uint)bVar18 * *(int *)(local_5e20 + 0x18) |
                                                 (uint)!bVar18 * (int)fStack_5e48;
                                            *(uint *)(local_5e20 + 0x1c) =
                                                 (uint)bVar21 * *(int *)(local_5e20 + 0x1c) |
                                                 (uint)!bVar21 * (int)fStack_5e44;
                                          }
                                          bVar55 = bVar55 & ~bVar47;
                                          auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                          auVar146 = ZEXT3264(auVar70);
                                          auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          auVar147 = ZEXT3264(auVar70);
                                          auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar148 = ZEXT3264(auVar70);
                                          auVar70 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar149 = ZEXT3264(auVar70);
                                          auVar64 = vxorps_avx512vl(auVar145,auVar145);
                                          auVar150 = ZEXT1664(auVar64);
                                          auVar64 = vmovdqa64_avx512vl(local_5ef0);
                                          auVar98 = ZEXT1664(auVar64);
                                          auVar64 = vmovdqa64_avx512vl(local_5f00);
                                          auVar151 = ZEXT1664(auVar64);
                                          goto LAB_007d198d;
                                        }
                                      }
                                    }
                                    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar146 = ZEXT3264(auVar70);
                                    auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar147 = ZEXT3264(auVar70);
                                    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar148 = ZEXT3264(auVar70);
                                    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar149 = ZEXT3264(auVar70);
                                    auVar64 = vxorps_avx512vl(auVar145,auVar145);
                                    auVar150 = ZEXT1664(auVar64);
                                    auVar64 = vmovdqa64_avx512vl(local_5ef0);
                                    auVar98 = ZEXT1664(auVar64);
                                    auVar64 = vmovdqa64_avx512vl(local_5f00);
                                    auVar151 = ZEXT1664(auVar64);
                                  }
                                }
                              }
LAB_007d198d:
                              if (bVar55 == 0) break;
                              pfVar61 = pfVar61 + 0x10;
                              bVar62 = uVar63 < 3;
                              uVar63 = uVar63 + 1;
                            } while (bVar62);
                            bVar51 = bVar51 & bVar55;
                            bVar62 = bVar51 == 0;
                            uVar54 = local_5d88;
                            uVar63 = local_5e08;
                            lVar52 = local_5d90;
                          }
                        } while ((!bVar62) && (uVar54 = uVar54 - 1 & uVar54, uVar54 != 0));
                      }
                      lVar52 = local_5d98 + 1;
                    } while (lVar52 != local_5da0);
                    bVar51 = ~bVar51;
                  }
                  auVar70 = auVar147._0_32_;
                  local_5f24 = local_5f24 | bVar51;
                  if (local_5f24 == 0xff) {
                    local_5f24 = 0xff;
                    goto LAB_007d2459;
                  }
                  auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar62 = (bool)(local_5f24 >> 1 & 1);
                  bVar14 = (bool)(local_5f24 >> 2 & 1);
                  bVar15 = (bool)(local_5f24 >> 3 & 1);
                  bVar16 = (bool)(local_5f24 >> 4 & 1);
                  bVar17 = (bool)(local_5f24 >> 5 & 1);
                  bVar18 = (bool)(local_5f24 >> 6 & 1);
                  local_59a0 = (uint)(local_5f24 & 1) * auVar70._0_4_ |
                               !(bool)(local_5f24 & 1) * local_59a0;
                  uStack_599c = (uint)bVar62 * auVar70._4_4_ | !bVar62 * uStack_599c;
                  uStack_5998 = (uint)bVar14 * auVar70._8_4_ | !bVar14 * uStack_5998;
                  uStack_5994 = (uint)bVar15 * auVar70._12_4_ | !bVar15 * uStack_5994;
                  uStack_5990 = (uint)bVar16 * auVar70._16_4_ | !bVar16 * uStack_5990;
                  uStack_598c = (uint)bVar17 * auVar70._20_4_ | !bVar17 * uStack_598c;
                  uStack_5988 = (uint)bVar18 * auVar70._24_4_ | !bVar18 * uStack_5988;
                  uStack_5984 = (uint)(local_5f24 >> 7) * auVar70._28_4_ |
                                !(bool)(local_5f24 >> 7) * uStack_5984;
                }
                goto LAB_007d114e;
              }
              lVar52 = 0;
              auVar70 = auVar148._0_32_;
              do {
                uVar54 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar52 * 8);
                if (uVar54 == 8) {
                  auVar98 = ZEXT3264(auVar70);
                  break;
                }
                auVar79._4_4_ = fStack_5a7c;
                auVar79._0_4_ = local_5a80;
                auVar79._8_4_ = fStack_5a78;
                auVar79._12_4_ = fStack_5a74;
                auVar79._16_4_ = fStack_5a70;
                auVar79._20_4_ = fStack_5a6c;
                auVar79._24_4_ = fStack_5a68;
                auVar79._28_4_ = uStack_5a64;
                uVar60 = *(undefined4 *)(root.ptr + 0x40 + lVar52 * 4);
                auVar82._4_4_ = uVar60;
                auVar82._0_4_ = uVar60;
                auVar82._8_4_ = uVar60;
                auVar82._12_4_ = uVar60;
                auVar82._16_4_ = uVar60;
                auVar82._20_4_ = uVar60;
                auVar82._24_4_ = uVar60;
                auVar82._28_4_ = uVar60;
                auVar64 = vfmsub132ps_fma(auVar82,auVar79,local_5ae0);
                auVar80._4_4_ = fStack_5a5c;
                auVar80._0_4_ = local_5a60;
                auVar80._8_4_ = fStack_5a58;
                auVar80._12_4_ = fStack_5a54;
                auVar80._16_4_ = fStack_5a50;
                auVar80._20_4_ = fStack_5a4c;
                auVar80._24_4_ = fStack_5a48;
                auVar80._28_4_ = uStack_5a44;
                uVar60 = *(undefined4 *)(root.ptr + 0x80 + lVar52 * 4);
                auVar83._4_4_ = uVar60;
                auVar83._0_4_ = uVar60;
                auVar83._8_4_ = uVar60;
                auVar83._12_4_ = uVar60;
                auVar83._16_4_ = uVar60;
                auVar83._20_4_ = uVar60;
                auVar83._24_4_ = uVar60;
                auVar83._28_4_ = uVar60;
                uVar60 = *(undefined4 *)(root.ptr + 0xc0 + lVar52 * 4);
                auVar84._4_4_ = uVar60;
                auVar84._0_4_ = uVar60;
                auVar84._8_4_ = uVar60;
                auVar84._12_4_ = uVar60;
                auVar84._16_4_ = uVar60;
                auVar84._20_4_ = uVar60;
                auVar84._24_4_ = uVar60;
                auVar84._28_4_ = uVar60;
                auVar65 = vfmsub132ps_fma(auVar83,auVar80,local_5ac0);
                auVar66 = vfmsub132ps_fma(auVar84,local_5a40,local_5aa0);
                uVar60 = *(undefined4 *)(root.ptr + 0x60 + lVar52 * 4);
                auVar76._4_4_ = uVar60;
                auVar76._0_4_ = uVar60;
                auVar76._8_4_ = uVar60;
                auVar76._12_4_ = uVar60;
                auVar76._16_4_ = uVar60;
                auVar76._20_4_ = uVar60;
                auVar76._24_4_ = uVar60;
                auVar76._28_4_ = uVar60;
                auVar71 = vfmsub132ps_avx512vl(local_5ae0,auVar79,auVar76);
                uVar60 = *(undefined4 *)(root.ptr + 0xa0 + lVar52 * 4);
                auVar77._4_4_ = uVar60;
                auVar77._0_4_ = uVar60;
                auVar77._8_4_ = uVar60;
                auVar77._12_4_ = uVar60;
                auVar77._16_4_ = uVar60;
                auVar77._20_4_ = uVar60;
                auVar77._24_4_ = uVar60;
                auVar77._28_4_ = uVar60;
                auVar73 = vfmsub132ps_avx512vl(local_5ac0,auVar80,auVar77);
                uVar60 = *(undefined4 *)(root.ptr + 0xe0 + lVar52 * 4);
                auVar78._4_4_ = uVar60;
                auVar78._0_4_ = uVar60;
                auVar78._8_4_ = uVar60;
                auVar78._12_4_ = uVar60;
                auVar78._16_4_ = uVar60;
                auVar78._20_4_ = uVar60;
                auVar78._24_4_ = uVar60;
                auVar78._28_4_ = uVar60;
                auVar74 = vfmsub132ps_avx512vl(local_5aa0,local_5a40,auVar78);
                auVar72 = vpminsd_avx2(ZEXT1632(auVar64),auVar71);
                auVar75 = vpminsd_avx2(ZEXT1632(auVar65),auVar73);
                auVar72 = vpmaxsd_avx2(auVar72,auVar75);
                auVar75 = vpminsd_avx2(ZEXT1632(auVar66),auVar74);
                auVar72 = vpmaxsd_avx2(auVar72,auVar75);
                auVar75 = vpmaxsd_avx2(ZEXT1632(auVar64),auVar71);
                auVar71 = vpmaxsd_avx2(ZEXT1632(auVar65),auVar73);
                auVar71 = vpminsd_avx2(auVar75,auVar71);
                auVar75 = vpmaxsd_avx2(ZEXT1632(auVar66),auVar74);
                auVar71 = vpminsd_avx2(auVar71,auVar75);
                auVar75 = vpmaxsd_avx2(auVar72,local_59c0);
                auVar81._4_4_ = uStack_599c;
                auVar81._0_4_ = local_59a0;
                auVar81._8_4_ = uStack_5998;
                auVar81._12_4_ = uStack_5994;
                auVar81._16_4_ = uStack_5990;
                auVar81._20_4_ = uStack_598c;
                auVar81._24_4_ = uStack_5988;
                auVar81._28_4_ = uStack_5984;
                auVar71 = vpminsd_avx2(auVar71,auVar81);
                uVar49 = vpcmpd_avx512vl(auVar75,auVar71,2);
                if ((byte)uVar49 == 0) {
                  auVar98 = ZEXT3264(auVar70);
                  uVar54 = uVar58;
                }
                else {
                  auVar75 = vblendmps_avx512vl(auVar148._0_32_,auVar72);
                  bVar62 = (bool)((byte)uVar49 & 1);
                  bVar14 = (bool)((byte)(uVar49 >> 1) & 1);
                  bVar15 = (bool)((byte)(uVar49 >> 2) & 1);
                  bVar16 = (bool)((byte)(uVar49 >> 3) & 1);
                  bVar17 = (bool)((byte)(uVar49 >> 4) & 1);
                  bVar18 = (bool)((byte)(uVar49 >> 5) & 1);
                  bVar21 = (bool)((byte)(uVar49 >> 6) & 1);
                  bVar24 = SUB81(uVar49 >> 7,0);
                  auVar98 = ZEXT3264(CONCAT428((uint)bVar24 * auVar75._28_4_ |
                                               (uint)!bVar24 * auVar72._28_4_,
                                               CONCAT424((uint)bVar21 * auVar75._24_4_ |
                                                         (uint)!bVar21 * auVar72._24_4_,
                                                         CONCAT420((uint)bVar18 * auVar75._20_4_ |
                                                                   (uint)!bVar18 * auVar72._20_4_,
                                                                   CONCAT416((uint)bVar17 *
                                                                             auVar75._16_4_ |
                                                                             (uint)!bVar17 *
                                                                             auVar72._16_4_,
                                                                             CONCAT412((uint)bVar16
                                                                                       * auVar75.
                                                  _12_4_ | (uint)!bVar16 * auVar72._12_4_,
                                                  CONCAT48((uint)bVar15 * auVar75._8_4_ |
                                                           (uint)!bVar15 * auVar72._8_4_,
                                                           CONCAT44((uint)bVar14 * auVar75._4_4_ |
                                                                    (uint)!bVar14 * auVar72._4_4_,
                                                                    (uint)bVar62 * auVar75._0_4_ |
                                                                    (uint)!bVar62 * auVar72._0_4_)))
                                                  )))));
                  if (uVar58 != 8) {
                    *puVar57 = uVar58;
                    puVar57 = puVar57 + 1;
                    *pauVar53 = auVar70;
                    pauVar53 = pauVar53 + 1;
                  }
                }
                uVar58 = uVar54;
                lVar52 = lVar52 + 1;
                auVar70 = auVar98._0_32_;
              } while (lVar52 != 8);
              if (uVar58 == 8) goto LAB_007d1300;
              auVar85._4_4_ = uStack_599c;
              auVar85._0_4_ = local_59a0;
              auVar85._8_4_ = uStack_5998;
              auVar85._12_4_ = uStack_5994;
              auVar85._16_4_ = uStack_5990;
              auVar85._20_4_ = uStack_598c;
              auVar85._24_4_ = uStack_5988;
              auVar85._28_4_ = uStack_5984;
              uVar25 = vcmpps_avx512vl(auVar98._0_32_,auVar85,9);
              root.ptr = uVar58;
            } while ((byte)uVar63 < (byte)POPCOUNT((int)uVar25));
            *puVar57 = uVar58;
            puVar57 = puVar57 + 1;
            *pauVar53 = auVar98._0_32_;
            pauVar53 = pauVar53 + 1;
LAB_007d1300:
            iVar48 = 4;
          }
          else {
            do {
              k = 0;
              for (uVar63 = uVar58; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              local_5ee0 = (float)k;
              fStack_5edc = (float)(k >> 0x20);
              bVar62 = occluded1(local_5da8,local_5db0,root,k,&local_5f09,ray,
                                 (TravRayK<8,_false> *)&local_5ba0.field_0,context);
              bVar51 = (byte)(1 << ((uint)local_5ee0 & 0x1f));
              if (!bVar62) {
                bVar51 = 0;
              }
              local_5f24 = local_5f24 | bVar51;
              uVar58 = uVar58 - 1 & uVar58;
            } while (uVar58 != 0);
            iVar48 = 3;
            if (local_5f24 != 0xff) {
              auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              bVar62 = (bool)(local_5f24 >> 1 & 1);
              bVar14 = (bool)(local_5f24 >> 2 & 1);
              bVar15 = (bool)(local_5f24 >> 3 & 1);
              bVar16 = (bool)(local_5f24 >> 4 & 1);
              bVar17 = (bool)(local_5f24 >> 5 & 1);
              bVar18 = (bool)(local_5f24 >> 6 & 1);
              local_59a0 = (uint)(local_5f24 & 1) * auVar70._0_4_ |
                           !(bool)(local_5f24 & 1) * local_59a0;
              uStack_599c = (uint)bVar62 * auVar70._4_4_ | !bVar62 * uStack_599c;
              uStack_5998 = (uint)bVar14 * auVar70._8_4_ | !bVar14 * uStack_5998;
              uStack_5994 = (uint)bVar15 * auVar70._12_4_ | !bVar15 * uStack_5994;
              uStack_5990 = (uint)bVar16 * auVar70._16_4_ | !bVar16 * uStack_5990;
              uStack_598c = (uint)bVar17 * auVar70._20_4_ | !bVar17 * uStack_598c;
              uStack_5988 = (uint)bVar18 * auVar70._24_4_ | !bVar18 * uStack_5988;
              uStack_5984 = (uint)(local_5f24 >> 7) * auVar70._28_4_ |
                            !(bool)(local_5f24 >> 7) * uStack_5984;
              iVar48 = 2;
            }
            auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar146 = ZEXT3264(auVar70);
            auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar147 = ZEXT3264(auVar70);
            auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar148 = ZEXT3264(auVar70);
            auVar70 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar149 = ZEXT3264(auVar70);
            auVar64 = vxorps_avx512vl(auVar150._0_16_,auVar150._0_16_);
            auVar150 = ZEXT1664(auVar64);
            auVar98 = ZEXT3264(_local_5e60);
            uVar63 = local_5e08;
            if ((uint)local_5e08 < (uint)POPCOUNT(uVar60)) goto LAB_007d1196;
          }
          auVar70 = auVar147._0_32_;
          if (iVar48 == 3) {
LAB_007d2459:
            local_5f24 = local_5f24 & (byte)local_5ea4;
            bVar62 = (bool)(local_5f24 >> 1 & 1);
            bVar14 = (bool)(local_5f24 >> 2 & 1);
            bVar15 = (bool)(local_5f24 >> 3 & 1);
            bVar16 = (bool)(local_5f24 >> 4 & 1);
            bVar17 = (bool)(local_5f24 >> 5 & 1);
            bVar18 = (bool)(local_5f24 >> 6 & 1);
            *(uint *)local_5e20 =
                 (uint)(local_5f24 & 1) * auVar70._0_4_ |
                 (uint)!(bool)(local_5f24 & 1) * *(int *)local_5e20;
            *(uint *)(local_5e20 + 4) =
                 (uint)bVar62 * auVar70._4_4_ | (uint)!bVar62 * *(int *)(local_5e20 + 4);
            *(uint *)(local_5e20 + 8) =
                 (uint)bVar14 * auVar70._8_4_ | (uint)!bVar14 * *(int *)(local_5e20 + 8);
            *(uint *)(local_5e20 + 0xc) =
                 (uint)bVar15 * auVar70._12_4_ | (uint)!bVar15 * *(int *)(local_5e20 + 0xc);
            *(uint *)(local_5e20 + 0x10) =
                 (uint)bVar16 * auVar70._16_4_ | (uint)!bVar16 * *(int *)(local_5e20 + 0x10);
            *(uint *)(local_5e20 + 0x14) =
                 (uint)bVar17 * auVar70._20_4_ | (uint)!bVar17 * *(int *)(local_5e20 + 0x14);
            *(uint *)(local_5e20 + 0x18) =
                 (uint)bVar18 * auVar70._24_4_ | (uint)!bVar18 * *(int *)(local_5e20 + 0x18);
            *(uint *)(local_5e20 + 0x1c) =
                 (uint)(local_5f24 >> 7) * auVar70._28_4_ |
                 (uint)!(bool)(local_5f24 >> 7) * *(int *)(local_5e20 + 0x1c);
            return;
          }
        } while( true );
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }